

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_elu(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  int iVar3;
  int iVar4;
  ggml_type gVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  ggml_tensor *pgVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  byte bVar29;
  char cVar30;
  ushort uVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong in_RCX;
  char *pcVar37;
  long lVar38;
  long lVar39;
  undefined8 uVar40;
  ggml_tensor *pgVar41;
  ggml_tensor *pgVar42;
  ggml_tensor *pgVar43;
  ggml_tensor *pgVar44;
  ggml_tensor *pgVar45;
  uint uVar46;
  ggml_tensor *pgVar47;
  ggml_tensor *pgVar48;
  ggml_tensor *pgVar49;
  ulong uVar50;
  long in_R9;
  ulong uVar51;
  int64_t ir;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  anon_union_4_2_947300a4 u;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auStack_6c0 [64];
  undefined8 uStack_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  ggml_tensor *pgStack_570;
  ggml_tensor *pgStack_568;
  ggml_tensor *pgStack_560;
  long lStack_558;
  long lStack_550;
  size_t sStack_548;
  size_t sStack_540;
  size_t sStack_538;
  size_t sStack_530;
  size_t sStack_528;
  size_t sStack_520;
  ggml_tensor *pgStack_518;
  ggml_tensor *pgStack_510;
  size_t sStack_508;
  ggml_tensor *pgStack_500;
  ggml_tensor *pgStack_4f8;
  ggml_tensor *pgStack_4f0;
  ggml_tensor *pgStack_4e8;
  ggml_tensor *pgStack_4e0;
  ggml_tensor *pgStack_4d8;
  long lStack_4d0;
  long lStack_4c8;
  size_t sStack_4c0;
  size_t sStack_4b8;
  size_t sStack_4b0;
  size_t sStack_4a8;
  size_t sStack_4a0;
  size_t sStack_498;
  ggml_tensor *pgStack_490;
  ggml_tensor *pgStack_488;
  size_t sStack_480;
  ggml_tensor *pgStack_478;
  ggml_tensor *pgStack_470;
  ggml_tensor *pgStack_468;
  ggml_tensor *pgStack_460;
  ggml_tensor *pgStack_458;
  ggml_tensor *pgStack_450;
  long lStack_448;
  long lStack_440;
  size_t sStack_438;
  size_t sStack_430;
  size_t sStack_428;
  size_t sStack_420;
  size_t sStack_418;
  size_t sStack_410;
  ggml_tensor *pgStack_408;
  ggml_tensor *pgStack_400;
  size_t sStack_3f8;
  ggml_tensor *pgStack_3f0;
  ggml_tensor *pgStack_3e8;
  ggml_tensor *pgStack_3e0;
  ggml_tensor *pgStack_3d8;
  ggml_tensor *pgStack_3d0;
  ggml_tensor *pgStack_3c8;
  long lStack_3c0;
  long lStack_3b8;
  size_t sStack_3b0;
  size_t sStack_3a8;
  size_t sStack_3a0;
  size_t sStack_398;
  size_t sStack_390;
  size_t sStack_388;
  ggml_tensor *pgStack_380;
  ggml_tensor *pgStack_378;
  size_t sStack_370;
  ggml_tensor *pgStack_368;
  ggml_tensor *pgStack_360;
  ggml_tensor *pgStack_358;
  ggml_tensor *pgStack_350;
  ggml_tensor *pgStack_348;
  ggml_tensor *pgStack_340;
  ggml_tensor *pgStack_338;
  size_t sStack_330;
  size_t sStack_328;
  size_t sStack_320;
  size_t sStack_318;
  size_t sStack_310;
  ggml_tensor *pgStack_308;
  ggml_tensor *pgStack_300;
  ggml_tensor *pgStack_2f8;
  ggml_tensor *pgStack_2f0;
  ggml_tensor *pgStack_2e8;
  ggml_tensor *pgStack_2e0;
  
  pgVar45 = dst->src[0];
  gVar2 = pgVar45->type;
  if ((gVar2 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar30 = ggml_is_contiguous_1(pgVar45);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar45,dst), cVar30 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012b92f;
      if (pgVar45->nb[0] == 4) {
        lVar39 = pgVar45->ne[1];
        lVar35 = pgVar45->ne[2];
        sVar6 = pgVar45->nb[1];
        sVar7 = pgVar45->nb[2];
        sVar8 = pgVar45->nb[3];
        lVar36 = dst->ne[0];
        sVar10 = dst->nb[1];
        sVar11 = dst->nb[2];
        sVar12 = dst->nb[3];
        iVar3 = params->ith;
        iVar4 = params->nth;
        lVar33 = ggml_nrows(pgVar45);
        lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
        lVar52 = iVar3 * lVar34;
        lVar34 = lVar34 + lVar52;
        if (lVar33 <= lVar34) {
          lVar34 = lVar33;
        }
        if (lVar34 <= lVar52) {
          return;
        }
        lVar35 = lVar35 * lVar39;
        do {
          lVar33 = lVar52 / lVar35;
          lVar38 = lVar52 % lVar35;
          lVar55 = lVar38 / lVar39;
          lVar38 = lVar38 % lVar39;
          if (0 < lVar36) {
            pvVar9 = dst->data;
            pvVar13 = pgVar45->data;
            lVar53 = 0;
            do {
              fVar69 = *(float *)((long)pvVar13 +
                                 lVar53 * 4 + lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8);
              if (fVar69 <= 0.0) {
                fVar69 = expm1f(fVar69);
              }
              *(float *)((long)pvVar9 +
                        lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) = fVar69;
              lVar53 = lVar53 + 1;
            } while (lVar36 != lVar53);
          }
          lVar52 = lVar52 + 1;
        } while (lVar52 != lVar34);
        return;
      }
LAB_0012b94b:
      pcVar37 = "nb00 == sizeof(src0_t)";
      uVar40 = 0x56;
      goto LAB_0012b965;
    }
  }
  else if ((gVar2 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar30 = ggml_is_contiguous_1(pgVar45);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar45,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar45->nb[0] == 2) {
          lVar39 = pgVar45->ne[1];
          lVar35 = pgVar45->ne[2];
          sVar6 = pgVar45->nb[1];
          sVar7 = pgVar45->nb[2];
          sVar8 = pgVar45->nb[3];
          lVar36 = dst->ne[0];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar33 = ggml_nrows(pgVar45);
          lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
          lVar52 = iVar3 * lVar34;
          lVar34 = lVar34 + lVar52;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar52) {
            return;
          }
          lVar35 = lVar35 * lVar39;
          do {
            lVar33 = lVar52 % lVar35;
            if (0 < lVar36) {
              pvVar9 = pgVar45->data;
              lVar55 = 0;
              do {
                fVar69 = *(float *)(&ggml_table_f32_f16 +
                                   (ulong)*(ushort *)
                                           ((long)pvVar9 +
                                           lVar55 * 2 +
                                           (lVar33 / lVar39) * sVar7 +
                                           (lVar33 % lVar39) * sVar6 + (lVar52 / lVar35) * sVar8) *
                                   4);
                auVar70 = ZEXT416((uint)fVar69);
                if (fVar69 <= 0.0) {
                  auVar62._0_4_ = expm1f(fVar69);
                  auVar62._4_60_ = extraout_var;
                  auVar70 = auVar62._0_16_;
                }
                auVar70 = vcvtps2ph_f16c(auVar70,0);
                vpextrw_avx(auVar70,0);
                lVar55 = lVar55 + 1;
              } while (lVar36 != lVar55);
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 != lVar34);
          return;
        }
        goto LAB_0012b94b;
      }
      goto LAB_0012b92f;
    }
  }
  else if (gVar2 == GGML_TYPE_BF16) {
    gVar5 = dst->type;
    in_RCX = (ulong)gVar5;
    if (gVar5 == GGML_TYPE_F32) {
      cVar30 = ggml_is_contiguous_1(pgVar45);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar45,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar45->nb[0] == 2) {
            lVar39 = pgVar45->ne[1];
            lVar35 = pgVar45->ne[2];
            sVar6 = pgVar45->nb[1];
            sVar7 = pgVar45->nb[2];
            sVar8 = pgVar45->nb[3];
            lVar36 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar33 = ggml_nrows(pgVar45);
            lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
            lVar52 = iVar3 * lVar34;
            lVar34 = lVar34 + lVar52;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar52) {
              return;
            }
            lVar35 = lVar35 * lVar39;
            do {
              lVar33 = lVar52 / lVar35;
              lVar38 = lVar52 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                pvVar9 = dst->data;
                pvVar13 = pgVar45->data;
                lVar53 = 0;
                do {
                  fVar69 = (float)((uint)*(ushort *)
                                          ((long)pvVar13 +
                                          lVar53 * 2 +
                                          lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) << 0x10)
                  ;
                  if (fVar69 <= 0.0) {
                    fVar69 = expm1f(fVar69);
                  }
                  *(float *)((long)pvVar9 +
                            lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                       fVar69;
                  lVar53 = lVar53 + 1;
                } while (lVar36 != lVar53);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
            return;
          }
          goto LAB_0012b94b;
        }
        goto LAB_0012b92f;
      }
    }
    else {
      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012b456;
      cVar30 = ggml_is_contiguous_1(pgVar45);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar45,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar45->nb[0] == 2) {
            lVar39 = pgVar45->ne[1];
            lVar35 = pgVar45->ne[2];
            sVar6 = pgVar45->nb[1];
            sVar7 = pgVar45->nb[2];
            sVar8 = pgVar45->nb[3];
            lVar36 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar33 = ggml_nrows(pgVar45);
            lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
            lVar52 = iVar3 * lVar34;
            lVar34 = lVar34 + lVar52;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar52) {
              return;
            }
            lVar35 = lVar35 * lVar39;
            do {
              lVar33 = lVar52 / lVar35;
              lVar38 = lVar52 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                pvVar9 = dst->data;
                pvVar13 = pgVar45->data;
                lVar53 = 0;
                do {
                  fVar69 = (float)((uint)*(ushort *)
                                          ((long)pvVar13 +
                                          lVar53 * 2 +
                                          lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) << 0x10)
                  ;
                  if (fVar69 <= 0.0) {
                    fVar69 = expm1f(fVar69);
                  }
                  if ((uint)ABS(fVar69) < 0x7f800001) {
                    uVar31 = (ushort)((int)fVar69 + 0x7fff + ((uint)fVar69 >> 0x10 & 1) >> 0x10);
                  }
                  else {
                    uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar9 + lVar53 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12)
                       = uVar31;
                  lVar53 = lVar53 + 1;
                } while (lVar36 != lVar53);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
            return;
          }
          goto LAB_0012b94b;
        }
        goto LAB_0012b92f;
      }
    }
  }
  else {
LAB_0012b456:
    if ((gVar2 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      pgVar41 = pgVar45;
      ggml_compute_forward_elu_cold_1();
      pgVar42 = pgVar41->src[0];
      gVar2 = pgVar42->type;
      if ((gVar2 == GGML_TYPE_F32) && (pgVar41->type == GGML_TYPE_F32)) {
        cVar30 = ggml_is_contiguous_1(pgVar42);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
          if (pgVar41->nb[0] != 4) goto LAB_0012c1b5;
          if (pgVar42->nb[0] == 4) {
            lVar39 = pgVar42->ne[1];
            lVar35 = pgVar42->ne[2];
            sVar6 = pgVar42->nb[1];
            sVar7 = pgVar42->nb[2];
            sVar8 = pgVar42->nb[3];
            lVar36 = pgVar41->ne[0];
            sVar10 = pgVar41->nb[1];
            sVar11 = pgVar41->nb[2];
            sVar12 = pgVar41->nb[3];
            gVar2 = dst->type;
            iVar3 = *(int *)&dst->field_0x4;
            lVar33 = ggml_nrows(pgVar42);
            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
            lVar52 = (int)gVar2 * lVar34;
            lVar34 = lVar34 + lVar52;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar52) {
              return;
            }
            lVar35 = lVar35 * lVar39;
            pvVar9 = pgVar41->data;
            pvVar13 = pgVar42->data;
            do {
              lVar33 = lVar52 / lVar35;
              lVar38 = lVar52 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                lVar53 = 0;
                do {
                  auVar70 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar13 +
                                                        lVar53 * 4 +
                                                        lVar55 * sVar7 +
                                                        lVar38 * sVar6 + lVar33 * sVar8)),
                                       ZEXT816(0) << 0x40);
                  *(int *)((long)pvVar9 +
                          lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                       auVar70._0_4_;
                  lVar53 = lVar53 + 1;
                } while (lVar36 != lVar53);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
            return;
          }
LAB_0012c1d1:
          pcVar37 = "nb00 == sizeof(src0_t)";
          uVar40 = 0x56;
          goto LAB_0012c1eb;
        }
      }
      else if ((gVar2 == GGML_TYPE_F16) && (pgVar41->type == GGML_TYPE_F16)) {
        cVar30 = ggml_is_contiguous_1(pgVar42);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
          if (pgVar41->nb[0] == 2) {
            if (pgVar42->nb[0] == 2) {
              lVar39 = pgVar42->ne[1];
              lVar35 = pgVar42->ne[2];
              sVar6 = pgVar42->nb[1];
              sVar7 = pgVar42->nb[2];
              sVar8 = pgVar42->nb[3];
              lVar36 = pgVar41->ne[0];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar33 = ggml_nrows();
              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
              lVar52 = (int)gVar2 * lVar34;
              lVar34 = lVar34 + lVar52;
              if (lVar33 <= lVar34) {
                lVar34 = lVar33;
              }
              if (lVar34 <= lVar52) {
                return;
              }
              lVar35 = lVar35 * lVar39;
              do {
                lVar33 = lVar52 % lVar35;
                if (0 < lVar36) {
                  lVar55 = 0;
                  do {
                    auVar70 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                          (ulong)*(ushort *)
                                                                  ((long)pgVar42->data +
                                                                  lVar55 * 2 +
                                                                  (lVar33 / lVar39) * sVar7 +
                                                                  (lVar33 % lVar39) * sVar6 +
                                                                  (lVar52 / lVar35) * sVar8) * 4)),
                                         ZEXT816(0) << 0x40);
                    auVar70 = vcvtps2ph_f16c(auVar70,0);
                    vpextrw_avx(auVar70,0);
                    lVar55 = lVar55 + 1;
                  } while (lVar36 != lVar55);
                }
                lVar52 = lVar52 + 1;
              } while (lVar52 != lVar34);
              return;
            }
            goto LAB_0012c1d1;
          }
          goto LAB_0012c1b5;
        }
      }
      else if (gVar2 == GGML_TYPE_BF16) {
        gVar5 = pgVar41->type;
        in_RCX = (ulong)gVar5;
        if (gVar5 == GGML_TYPE_F32) {
          cVar30 = ggml_is_contiguous_1(pgVar42);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
            if (pgVar41->nb[0] == 4) {
              if (pgVar42->nb[0] == 2) {
                lVar39 = pgVar42->ne[1];
                lVar35 = pgVar42->ne[2];
                sVar6 = pgVar42->nb[1];
                sVar7 = pgVar42->nb[2];
                sVar8 = pgVar42->nb[3];
                lVar36 = pgVar41->ne[0];
                sVar10 = pgVar41->nb[1];
                sVar11 = pgVar41->nb[2];
                sVar12 = pgVar41->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar33 = ggml_nrows(pgVar42);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar52 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar52;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar52) {
                  return;
                }
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar41->data;
                pvVar13 = pgVar42->data;
                auVar68 = vpbroadcastq_avx512f();
                auVar64 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar65 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                do {
                  lVar33 = lVar52 / lVar35;
                  lVar38 = lVar52 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    uVar51 = 0;
                    do {
                      auVar66 = vpbroadcastq_avx512f();
                      auVar67 = vporq_avx512f(auVar66,auVar64);
                      auVar66 = vporq_avx512f(auVar66,auVar65);
                      uVar40 = vpcmpuq_avx512f(auVar66,auVar68,2);
                      bVar28 = (byte)uVar40;
                      uVar40 = vpcmpuq_avx512f(auVar67,auVar68,2);
                      bVar29 = (byte)uVar40;
                      uVar31 = CONCAT11(bVar29,bVar28);
                      auVar60 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                    ((long)pvVar13 +
                                                    uVar51 * 2 +
                                                    lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8
                                                    ));
                      auVar56._2_2_ = (ushort)((byte)(uVar31 >> 1) & 1) * auVar60._2_2_;
                      auVar56._0_2_ = (ushort)(bVar28 & 1) * auVar60._0_2_;
                      auVar56._4_2_ = (ushort)((byte)(uVar31 >> 2) & 1) * auVar60._4_2_;
                      auVar56._6_2_ = (ushort)((byte)(uVar31 >> 3) & 1) * auVar60._6_2_;
                      auVar56._8_2_ = (ushort)((byte)(uVar31 >> 4) & 1) * auVar60._8_2_;
                      auVar56._10_2_ = (ushort)((byte)(uVar31 >> 5) & 1) * auVar60._10_2_;
                      auVar56._12_2_ = (ushort)((byte)(uVar31 >> 6) & 1) * auVar60._12_2_;
                      auVar56._14_2_ = (ushort)((byte)(uVar31 >> 7) & 1) * auVar60._14_2_;
                      auVar56._16_2_ = (ushort)(bVar29 & 1) * auVar60._16_2_;
                      auVar56._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar60._18_2_;
                      auVar56._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar60._20_2_;
                      auVar56._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar60._22_2_;
                      auVar56._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar60._24_2_;
                      auVar56._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar60._26_2_;
                      auVar56._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar60._28_2_;
                      auVar56._30_2_ = (ushort)(bVar29 >> 7) * auVar60._30_2_;
                      auVar66 = vpmovzxwd_avx512f(auVar56);
                      auVar66 = vpslld_avx512f(auVar66,0x10);
                      auVar66 = vmaxps_avx512f(auVar66,ZEXT1664(ZEXT816(0) << 0x40));
                      puVar1 = (uint *)((long)pvVar9 +
                                       uVar51 * 4 +
                                       lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12);
                      bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
                      bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                      bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
                      bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
                      bVar21 = (bool)((byte)(uVar31 >> 7) & 1);
                      bVar22 = (bool)(bVar29 >> 1 & 1);
                      bVar23 = (bool)(bVar29 >> 2 & 1);
                      bVar24 = (bool)(bVar29 >> 3 & 1);
                      bVar25 = (bool)(bVar29 >> 4 & 1);
                      bVar26 = (bool)(bVar29 >> 5 & 1);
                      bVar27 = (bool)(bVar29 >> 6 & 1);
                      *puVar1 = (uint)(bVar28 & 1) * auVar66._0_4_ |
                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                      puVar1[1] = (uint)bVar15 * auVar66._4_4_ | (uint)!bVar15 * puVar1[1];
                      puVar1[2] = (uint)bVar16 * auVar66._8_4_ | (uint)!bVar16 * puVar1[2];
                      puVar1[3] = (uint)bVar17 * auVar66._12_4_ | (uint)!bVar17 * puVar1[3];
                      puVar1[4] = (uint)bVar18 * auVar66._16_4_ | (uint)!bVar18 * puVar1[4];
                      puVar1[5] = (uint)bVar19 * auVar66._20_4_ | (uint)!bVar19 * puVar1[5];
                      puVar1[6] = (uint)bVar20 * auVar66._24_4_ | (uint)!bVar20 * puVar1[6];
                      puVar1[7] = (uint)bVar21 * auVar66._28_4_ | (uint)!bVar21 * puVar1[7];
                      puVar1[8] = (uint)(bVar29 & 1) * auVar66._32_4_ |
                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                      puVar1[9] = (uint)bVar22 * auVar66._36_4_ | (uint)!bVar22 * puVar1[9];
                      puVar1[10] = (uint)bVar23 * auVar66._40_4_ | (uint)!bVar23 * puVar1[10];
                      puVar1[0xb] = (uint)bVar24 * auVar66._44_4_ | (uint)!bVar24 * puVar1[0xb];
                      puVar1[0xc] = (uint)bVar25 * auVar66._48_4_ | (uint)!bVar25 * puVar1[0xc];
                      puVar1[0xd] = (uint)bVar26 * auVar66._52_4_ | (uint)!bVar26 * puVar1[0xd];
                      puVar1[0xe] = (uint)bVar27 * auVar66._56_4_ | (uint)!bVar27 * puVar1[0xe];
                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar66._60_4_ |
                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                      uVar51 = uVar51 + 0x10;
                    } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar51);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 != lVar34);
                return;
              }
              goto LAB_0012c1d1;
            }
            goto LAB_0012c1b5;
          }
        }
        else {
          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012bce7;
          cVar30 = ggml_is_contiguous_1(pgVar42);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
            if (pgVar41->nb[0] == 2) {
              if (pgVar42->nb[0] == 2) {
                lVar39 = pgVar42->ne[1];
                lVar35 = pgVar42->ne[2];
                sVar6 = pgVar42->nb[1];
                sVar7 = pgVar42->nb[2];
                sVar8 = pgVar42->nb[3];
                lVar36 = pgVar41->ne[0];
                sVar10 = pgVar41->nb[1];
                sVar11 = pgVar41->nb[2];
                sVar12 = pgVar41->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar33 = ggml_nrows(pgVar42);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar52 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar52;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar52) {
                  return;
                }
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar41->data;
                pvVar13 = pgVar42->data;
                do {
                  lVar33 = lVar52 / lVar35;
                  lVar38 = lVar52 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    lVar53 = 0;
                    do {
                      auVar70 = vmaxss_avx(ZEXT216(*(ushort *)
                                                    ((long)pvVar13 +
                                                    lVar53 * 2 +
                                                    lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8
                                                    )) << 0x10,ZEXT816(0) << 0x40);
                      uVar32 = auVar70._0_4_;
                      if (uVar32 < 0x7f800001) {
                        uVar31 = (ushort)(uVar32 + 0x7fff + (uVar32 >> 0x10 & 1) >> 0x10);
                      }
                      else {
                        uVar31 = auVar70._2_2_ | 0x40;
                      }
                      *(ushort *)
                       ((long)pvVar9 +
                       lVar53 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) = uVar31;
                      lVar53 = lVar53 + 1;
                    } while (lVar36 != lVar53);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 != lVar34);
                return;
              }
              goto LAB_0012c1d1;
            }
            goto LAB_0012c1b5;
          }
        }
      }
      else {
LAB_0012bce7:
        if ((gVar2 != GGML_TYPE_F16) || (pgVar41->type != GGML_TYPE_F32)) {
          ggml_compute_forward_relu_cold_1();
          pgVar43 = pgVar42->src[0];
          gVar2 = pgVar43->type;
          if ((gVar2 == GGML_TYPE_F32) && (pgVar42->type == GGML_TYPE_F32)) {
            cVar30 = ggml_is_contiguous_1(pgVar43);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
              if (pgVar42->nb[0] != 4) goto LAB_0012cb39;
              if (pgVar43->nb[0] == 4) {
                lVar39 = pgVar43->ne[1];
                lVar35 = pgVar43->ne[2];
                sVar6 = pgVar43->nb[1];
                sVar7 = pgVar43->nb[2];
                sVar8 = pgVar43->nb[3];
                lVar36 = pgVar42->ne[0];
                sVar10 = pgVar42->nb[1];
                sVar11 = pgVar42->nb[2];
                sVar12 = pgVar42->nb[3];
                gVar2 = pgVar41->type;
                iVar3 = *(int *)&pgVar41->field_0x4;
                lVar33 = ggml_nrows(pgVar43);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar52 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar52;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar52) {
                  return;
                }
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar42->data;
                pvVar13 = pgVar43->data;
                do {
                  lVar33 = lVar52 / lVar35;
                  lVar38 = lVar52 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    lVar53 = 0;
                    do {
                      fVar69 = expf(-*(float *)((long)pvVar13 +
                                               lVar53 * 4 +
                                               lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8));
                      *(float *)((long)pvVar9 +
                                lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                           1.0 / (fVar69 + 1.0);
                      lVar53 = lVar53 + 1;
                    } while (lVar36 != lVar53);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 != lVar34);
                return;
              }
LAB_0012cb55:
              pcVar37 = "nb00 == sizeof(src0_t)";
              uVar40 = 0x56;
              goto LAB_0012cb6f;
            }
          }
          else if ((gVar2 == GGML_TYPE_F16) && (pgVar42->type == GGML_TYPE_F16)) {
            cVar30 = ggml_is_contiguous_1(pgVar43);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
              if (pgVar42->nb[0] == 2) {
                if (pgVar43->nb[0] == 2) {
                  lVar39 = pgVar43->ne[1];
                  lVar35 = pgVar43->ne[2];
                  sVar6 = pgVar43->nb[1];
                  sVar7 = pgVar43->nb[2];
                  sVar8 = pgVar43->nb[3];
                  lVar36 = pgVar42->ne[0];
                  gVar2 = pgVar41->type;
                  iVar3 = *(int *)&pgVar41->field_0x4;
                  lVar33 = ggml_nrows(pgVar43);
                  lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                  lVar52 = (int)gVar2 * lVar34;
                  lVar34 = lVar34 + lVar52;
                  if (lVar33 <= lVar34) {
                    lVar34 = lVar33;
                  }
                  if (lVar34 <= lVar52) {
                    return;
                  }
                  lVar35 = lVar35 * lVar39;
                  pvVar9 = pgVar43->data;
                  do {
                    lVar33 = lVar52 % lVar35;
                    if (0 < lVar36) {
                      lVar55 = 0;
                      do {
                        fVar69 = expf(-*(float *)(&ggml_table_f32_f16 +
                                                 (ulong)*(ushort *)
                                                         ((long)pvVar9 +
                                                         lVar55 * 2 +
                                                         (lVar33 / lVar39) * sVar7 +
                                                         (lVar33 % lVar39) * sVar6 +
                                                         (lVar52 / lVar35) * sVar8) * 4));
                        auVar70 = vcvtps2ph_f16c(ZEXT416((uint)(1.0 / (fVar69 + 1.0))),0);
                        vpextrw_avx(auVar70,0);
                        lVar55 = lVar55 + 1;
                      } while (lVar36 != lVar55);
                    }
                    lVar52 = lVar52 + 1;
                  } while (lVar52 != lVar34);
                  return;
                }
                goto LAB_0012cb55;
              }
              goto LAB_0012cb39;
            }
          }
          else if (gVar2 == GGML_TYPE_BF16) {
            gVar5 = pgVar42->type;
            in_RCX = (ulong)gVar5;
            if (gVar5 == GGML_TYPE_F32) {
              cVar30 = ggml_is_contiguous_1(pgVar43);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                if (pgVar42->nb[0] == 4) {
                  if (pgVar43->nb[0] == 2) {
                    lVar39 = pgVar43->ne[1];
                    lVar35 = pgVar43->ne[2];
                    sVar6 = pgVar43->nb[1];
                    sVar7 = pgVar43->nb[2];
                    sVar8 = pgVar43->nb[3];
                    lVar36 = pgVar42->ne[0];
                    sVar10 = pgVar42->nb[1];
                    sVar11 = pgVar42->nb[2];
                    sVar12 = pgVar42->nb[3];
                    gVar2 = pgVar41->type;
                    iVar3 = *(int *)&pgVar41->field_0x4;
                    lVar33 = ggml_nrows(pgVar43);
                    lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                    lVar52 = (int)gVar2 * lVar34;
                    lVar34 = lVar34 + lVar52;
                    if (lVar33 <= lVar34) {
                      lVar34 = lVar33;
                    }
                    if (lVar34 <= lVar52) {
                      return;
                    }
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar42->data;
                    pvVar13 = pgVar43->data;
                    do {
                      lVar33 = lVar52 / lVar35;
                      lVar38 = lVar52 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar53 = 0;
                        do {
                          fVar69 = expf((float)((uint)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar53 * 2 +
                                                       lVar55 * sVar7 +
                                                       lVar38 * sVar6 + lVar33 * sVar8) * 0x10000 +
                                               -0x80000000));
                          *(float *)((long)pvVar9 +
                                    lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12
                                    ) = 1.0 / (fVar69 + 1.0);
                          lVar53 = lVar53 + 1;
                        } while (lVar36 != lVar53);
                      }
                      lVar52 = lVar52 + 1;
                    } while (lVar52 != lVar34);
                    return;
                  }
                  goto LAB_0012cb55;
                }
                goto LAB_0012cb39;
              }
            }
            else {
              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012c5f1;
              cVar30 = ggml_is_contiguous_1(pgVar43);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                if (pgVar42->nb[0] == 2) {
                  if (pgVar43->nb[0] == 2) {
                    lVar39 = pgVar43->ne[1];
                    lVar35 = pgVar43->ne[2];
                    sVar6 = pgVar43->nb[1];
                    sVar7 = pgVar43->nb[2];
                    sVar8 = pgVar43->nb[3];
                    lVar36 = pgVar42->ne[0];
                    sVar10 = pgVar42->nb[1];
                    sVar11 = pgVar42->nb[2];
                    sVar12 = pgVar42->nb[3];
                    gVar2 = pgVar41->type;
                    iVar3 = *(int *)&pgVar41->field_0x4;
                    lVar33 = ggml_nrows(pgVar43);
                    lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                    lVar52 = (int)gVar2 * lVar34;
                    lVar34 = lVar34 + lVar52;
                    if (lVar33 <= lVar34) {
                      lVar34 = lVar33;
                    }
                    if (lVar34 <= lVar52) {
                      return;
                    }
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar42->data;
                    pvVar13 = pgVar43->data;
                    do {
                      lVar33 = lVar52 / lVar35;
                      lVar38 = lVar52 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar53 = 0;
                        do {
                          fVar69 = expf((float)((uint)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar53 * 2 +
                                                       lVar55 * sVar7 +
                                                       lVar38 * sVar6 + lVar33 * sVar8) * 0x10000 +
                                               -0x80000000));
                          fVar69 = 1.0 / (fVar69 + 1.0);
                          if ((uint)ABS(fVar69) < 0x7f800001) {
                            uVar31 = (ushort)((int)fVar69 + 0x7fff + ((uint)fVar69 >> 0x10 & 1) >>
                                             0x10);
                          }
                          else {
                            uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                          }
                          *(ushort *)
                           ((long)pvVar9 +
                           lVar53 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                               uVar31;
                          lVar53 = lVar53 + 1;
                        } while (lVar36 != lVar53);
                      }
                      lVar52 = lVar52 + 1;
                    } while (lVar52 != lVar34);
                    return;
                  }
                  goto LAB_0012cb55;
                }
                goto LAB_0012cb39;
              }
            }
          }
          else {
LAB_0012c5f1:
            if ((gVar2 != GGML_TYPE_F16) || (pgVar42->type != GGML_TYPE_F32)) {
              ggml_compute_forward_sigmoid_cold_1();
              pgVar41 = pgVar43->src[0];
              gVar2 = pgVar41->type;
              if ((gVar2 == GGML_TYPE_F32) && (pgVar43->type == GGML_TYPE_F32)) {
                cVar30 = ggml_is_contiguous_1(pgVar41);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                  if (pgVar43->nb[0] != 4) goto LAB_0012d47e;
                  if (pgVar41->nb[0] == 4) {
                    lVar39 = pgVar41->ne[1];
                    lVar35 = pgVar41->ne[2];
                    sVar6 = pgVar41->nb[1];
                    sVar7 = pgVar41->nb[2];
                    sVar8 = pgVar41->nb[3];
                    lVar36 = pgVar43->ne[0];
                    sVar10 = pgVar43->nb[1];
                    sVar11 = pgVar43->nb[2];
                    sVar12 = pgVar43->nb[3];
                    gVar2 = pgVar42->type;
                    iVar3 = *(int *)&pgVar42->field_0x4;
                    lVar33 = ggml_nrows(pgVar41);
                    lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                    lVar52 = (int)gVar2 * lVar34;
                    lVar34 = lVar34 + lVar52;
                    if (lVar33 <= lVar34) {
                      lVar34 = lVar33;
                    }
                    if (lVar34 <= lVar52) {
                      return;
                    }
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar43->data;
                    pvVar13 = pgVar41->data;
                    do {
                      lVar33 = lVar52 / lVar35;
                      lVar38 = lVar52 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar53 = 0;
                        do {
                          auVar76._0_4_ =
                               (*(float *)((long)pvVar13 +
                                          lVar53 * 4 +
                                          lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) + 3.0) /
                               6.0;
                          auVar76._4_12_ = SUB6012((undefined1  [60])0x0,0);
                          auVar70 = vmaxss_avx(auVar76,ZEXT816(0) << 0x40);
                          auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                          *(int *)((long)pvVar9 +
                                  lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12)
                               = auVar70._0_4_;
                          lVar53 = lVar53 + 1;
                        } while (lVar36 != lVar53);
                      }
                      lVar52 = lVar52 + 1;
                    } while (lVar52 != lVar34);
                    return;
                  }
LAB_0012d49a:
                  pcVar37 = "nb00 == sizeof(src0_t)";
                  uVar40 = 0x56;
                  goto LAB_0012d4b4;
                }
              }
              else if ((gVar2 == GGML_TYPE_F16) && (pgVar43->type == GGML_TYPE_F16)) {
                cVar30 = ggml_is_contiguous_1(pgVar41);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                  if (pgVar43->nb[0] == 2) {
                    if (pgVar41->nb[0] == 2) {
                      lVar39 = pgVar41->ne[1];
                      lVar35 = pgVar41->ne[2];
                      sVar6 = pgVar41->nb[1];
                      sVar7 = pgVar41->nb[2];
                      sVar8 = pgVar41->nb[3];
                      lVar36 = pgVar43->ne[0];
                      gVar2 = pgVar42->type;
                      iVar3 = *(int *)&pgVar42->field_0x4;
                      lVar33 = ggml_nrows();
                      lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                      lVar52 = (int)gVar2 * lVar34;
                      lVar34 = lVar34 + lVar52;
                      if (lVar33 <= lVar34) {
                        lVar34 = lVar33;
                      }
                      if (lVar34 <= lVar52) {
                        return;
                      }
                      lVar35 = lVar35 * lVar39;
                      do {
                        lVar33 = lVar52 % lVar35;
                        if (0 < lVar36) {
                          lVar55 = 0;
                          do {
                            auVar73._0_4_ =
                                 (*(float *)(&ggml_table_f32_f16 +
                                            (ulong)*(ushort *)
                                                    ((long)pgVar41->data +
                                                    lVar55 * 2 +
                                                    (lVar33 / lVar39) * sVar7 +
                                                    (lVar33 % lVar39) * sVar6 +
                                                    (lVar52 / lVar35) * sVar8) * 4) + 3.0) / 6.0;
                            auVar73._4_12_ = SUB6012((undefined1  [60])0x0,0);
                            auVar70 = vmaxss_avx(auVar73,ZEXT816(0) << 0x40);
                            auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                            auVar70 = vcvtps2ph_f16c(auVar70,0);
                            vpextrw_avx(auVar70,0);
                            lVar55 = lVar55 + 1;
                          } while (lVar36 != lVar55);
                        }
                        lVar52 = lVar52 + 1;
                      } while (lVar52 != lVar34);
                      return;
                    }
                    goto LAB_0012d49a;
                  }
                  goto LAB_0012d47e;
                }
              }
              else if (gVar2 == GGML_TYPE_BF16) {
                gVar5 = pgVar43->type;
                in_RCX = (ulong)gVar5;
                if (gVar5 == GGML_TYPE_F32) {
                  cVar30 = ggml_is_contiguous_1(pgVar41);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                    if (pgVar43->nb[0] == 4) {
                      if (pgVar41->nb[0] == 2) {
                        lVar39 = pgVar41->ne[1];
                        lVar35 = pgVar41->ne[2];
                        sVar6 = pgVar41->nb[1];
                        sVar7 = pgVar41->nb[2];
                        sVar8 = pgVar41->nb[3];
                        lVar36 = pgVar43->ne[0];
                        sVar10 = pgVar43->nb[1];
                        sVar11 = pgVar43->nb[2];
                        sVar12 = pgVar43->nb[3];
                        gVar2 = pgVar42->type;
                        iVar3 = *(int *)&pgVar42->field_0x4;
                        lVar33 = ggml_nrows(pgVar41);
                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                        lVar52 = (int)gVar2 * lVar34;
                        lVar34 = lVar34 + lVar52;
                        if (lVar33 <= lVar34) {
                          lVar34 = lVar33;
                        }
                        if (lVar34 <= lVar52) {
                          return;
                        }
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar43->data;
                        pvVar13 = pgVar41->data;
                        auVar68 = vpbroadcastq_avx512f();
                        auVar64 = vbroadcastss_avx512f(ZEXT416(0x40400000));
                        auVar65 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
                        auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        auVar61 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                        do {
                          lVar33 = lVar52 / lVar35;
                          lVar38 = lVar52 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            uVar51 = 0;
                            do {
                              auVar62 = vpbroadcastq_avx512f();
                              auVar63 = vporq_avx512f(auVar62,auVar66);
                              auVar62 = vporq_avx512f(auVar62,auVar67);
                              uVar40 = vpcmpuq_avx512f(auVar62,auVar68,2);
                              bVar28 = (byte)uVar40;
                              uVar40 = vpcmpuq_avx512f(auVar63,auVar68,2);
                              bVar29 = (byte)uVar40;
                              uVar31 = CONCAT11(bVar29,bVar28);
                              auVar60 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                            ((long)pvVar13 +
                                                            uVar51 * 2 +
                                                            lVar55 * sVar7 +
                                                            lVar38 * sVar6 + lVar33 * sVar8));
                              auVar57._2_2_ = (ushort)((byte)(uVar31 >> 1) & 1) * auVar60._2_2_;
                              auVar57._0_2_ = (ushort)(bVar28 & 1) * auVar60._0_2_;
                              auVar57._4_2_ = (ushort)((byte)(uVar31 >> 2) & 1) * auVar60._4_2_;
                              auVar57._6_2_ = (ushort)((byte)(uVar31 >> 3) & 1) * auVar60._6_2_;
                              auVar57._8_2_ = (ushort)((byte)(uVar31 >> 4) & 1) * auVar60._8_2_;
                              auVar57._10_2_ = (ushort)((byte)(uVar31 >> 5) & 1) * auVar60._10_2_;
                              auVar57._12_2_ = (ushort)((byte)(uVar31 >> 6) & 1) * auVar60._12_2_;
                              auVar57._14_2_ = (ushort)((byte)(uVar31 >> 7) & 1) * auVar60._14_2_;
                              auVar57._16_2_ = (ushort)(bVar29 & 1) * auVar60._16_2_;
                              auVar57._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar60._18_2_;
                              auVar57._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar60._20_2_;
                              auVar57._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar60._22_2_;
                              auVar57._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar60._24_2_;
                              auVar57._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar60._26_2_;
                              auVar57._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar60._28_2_;
                              auVar57._30_2_ = (ushort)(bVar29 >> 7) * auVar60._30_2_;
                              auVar62 = vpmovzxwd_avx512f(auVar57);
                              auVar62 = vpslld_avx512f(auVar62,0x10);
                              auVar62 = vaddps_avx512f(auVar62,auVar64);
                              auVar62 = vdivps_avx512f(auVar62,auVar65);
                              auVar62 = vmaxps_avx512f(auVar62,ZEXT1664(ZEXT816(0) << 0x40));
                              auVar62 = vminps_avx512f(auVar62,auVar61);
                              puVar1 = (uint *)((long)pvVar9 +
                                               uVar51 * 4 +
                                               lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12);
                              bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
                              bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                              bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
                              bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                              bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
                              bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
                              bVar21 = (bool)((byte)(uVar31 >> 7) & 1);
                              bVar22 = (bool)(bVar29 >> 1 & 1);
                              bVar23 = (bool)(bVar29 >> 2 & 1);
                              bVar24 = (bool)(bVar29 >> 3 & 1);
                              bVar25 = (bool)(bVar29 >> 4 & 1);
                              bVar26 = (bool)(bVar29 >> 5 & 1);
                              bVar27 = (bool)(bVar29 >> 6 & 1);
                              *puVar1 = (uint)(bVar28 & 1) * auVar62._0_4_ |
                                        (uint)!(bool)(bVar28 & 1) * *puVar1;
                              puVar1[1] = (uint)bVar15 * auVar62._4_4_ | (uint)!bVar15 * puVar1[1];
                              puVar1[2] = (uint)bVar16 * auVar62._8_4_ | (uint)!bVar16 * puVar1[2];
                              puVar1[3] = (uint)bVar17 * auVar62._12_4_ | (uint)!bVar17 * puVar1[3];
                              puVar1[4] = (uint)bVar18 * auVar62._16_4_ | (uint)!bVar18 * puVar1[4];
                              puVar1[5] = (uint)bVar19 * auVar62._20_4_ | (uint)!bVar19 * puVar1[5];
                              puVar1[6] = (uint)bVar20 * auVar62._24_4_ | (uint)!bVar20 * puVar1[6];
                              puVar1[7] = (uint)bVar21 * auVar62._28_4_ | (uint)!bVar21 * puVar1[7];
                              puVar1[8] = (uint)(bVar29 & 1) * auVar62._32_4_ |
                                          (uint)!(bool)(bVar29 & 1) * puVar1[8];
                              puVar1[9] = (uint)bVar22 * auVar62._36_4_ | (uint)!bVar22 * puVar1[9];
                              puVar1[10] = (uint)bVar23 * auVar62._40_4_ |
                                           (uint)!bVar23 * puVar1[10];
                              puVar1[0xb] = (uint)bVar24 * auVar62._44_4_ |
                                            (uint)!bVar24 * puVar1[0xb];
                              puVar1[0xc] = (uint)bVar25 * auVar62._48_4_ |
                                            (uint)!bVar25 * puVar1[0xc];
                              puVar1[0xd] = (uint)bVar26 * auVar62._52_4_ |
                                            (uint)!bVar26 * puVar1[0xd];
                              puVar1[0xe] = (uint)bVar27 * auVar62._56_4_ |
                                            (uint)!bVar27 * puVar1[0xe];
                              puVar1[0xf] = (uint)(bVar29 >> 7) * auVar62._60_4_ |
                                            (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                              uVar51 = uVar51 + 0x10;
                            } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar51);
                          }
                          lVar52 = lVar52 + 1;
                        } while (lVar52 != lVar34);
                        return;
                      }
                      goto LAB_0012d49a;
                    }
                    goto LAB_0012d47e;
                  }
                }
                else {
                  if (gVar5 != GGML_TYPE_BF16) goto LAB_0012cf3f;
                  cVar30 = ggml_is_contiguous_1(pgVar41);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                    if (pgVar43->nb[0] == 2) {
                      if (pgVar41->nb[0] == 2) {
                        lVar39 = pgVar41->ne[1];
                        lVar35 = pgVar41->ne[2];
                        sVar6 = pgVar41->nb[1];
                        sVar7 = pgVar41->nb[2];
                        sVar8 = pgVar41->nb[3];
                        lVar36 = pgVar43->ne[0];
                        sVar10 = pgVar43->nb[1];
                        sVar11 = pgVar43->nb[2];
                        sVar12 = pgVar43->nb[3];
                        gVar2 = pgVar42->type;
                        iVar3 = *(int *)&pgVar42->field_0x4;
                        lVar33 = ggml_nrows(pgVar41);
                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                        lVar52 = (int)gVar2 * lVar34;
                        lVar34 = lVar34 + lVar52;
                        if (lVar33 <= lVar34) {
                          lVar34 = lVar33;
                        }
                        if (lVar34 <= lVar52) {
                          return;
                        }
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar43->data;
                        pvVar13 = pgVar41->data;
                        do {
                          lVar33 = lVar52 / lVar35;
                          lVar38 = lVar52 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar53 = 0;
                            do {
                              auVar74._0_4_ =
                                   ((float)((uint)*(ushort *)
                                                   ((long)pvVar13 +
                                                   lVar53 * 2 +
                                                   lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8)
                                           << 0x10) + 3.0) / 6.0;
                              auVar74._4_12_ = SUB6012((undefined1  [60])0x0,0);
                              auVar70 = vmaxss_avx(auVar74,ZEXT816(0) << 0x40);
                              auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                              uVar32 = auVar70._0_4_;
                              if ((uVar32 & 0x7fffffff) < 0x7f800001) {
                                uVar31 = (ushort)(uVar32 + 0x7fff + (uVar32 >> 0x10 & 1) >> 0x10);
                              }
                              else {
                                uVar31 = auVar70._2_2_ | 0x40;
                              }
                              *(ushort *)
                               ((long)pvVar9 +
                               lVar53 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                   uVar31;
                              lVar53 = lVar53 + 1;
                            } while (lVar36 != lVar53);
                          }
                          lVar52 = lVar52 + 1;
                        } while (lVar52 != lVar34);
                        return;
                      }
                      goto LAB_0012d49a;
                    }
                    goto LAB_0012d47e;
                  }
                }
              }
              else {
LAB_0012cf3f:
                if ((gVar2 != GGML_TYPE_F16) || (pgVar43->type != GGML_TYPE_F32)) {
                  ggml_compute_forward_hardsigmoid_cold_1();
                  pgVar42 = pgVar41->src[0];
                  gVar2 = pgVar42->type;
                  if ((gVar2 == GGML_TYPE_F32) && (pgVar41->type == GGML_TYPE_F32)) {
                    cVar30 = ggml_is_contiguous_1(pgVar42);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                      if (pgVar41->nb[0] != 4) goto LAB_0012dd5e;
                      if (pgVar42->nb[0] == 4) {
                        lVar39 = pgVar42->ne[1];
                        lVar35 = pgVar42->ne[2];
                        sVar6 = pgVar42->nb[1];
                        sVar7 = pgVar42->nb[2];
                        sVar8 = pgVar42->nb[3];
                        lVar36 = pgVar41->ne[0];
                        sVar10 = pgVar41->nb[1];
                        sVar11 = pgVar41->nb[2];
                        sVar12 = pgVar41->nb[3];
                        gVar2 = pgVar43->type;
                        iVar3 = *(int *)&pgVar43->field_0x4;
                        lVar33 = ggml_nrows(pgVar42);
                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                        lVar52 = (int)gVar2 * lVar34;
                        lVar34 = lVar34 + lVar52;
                        if (lVar33 <= lVar34) {
                          lVar34 = lVar33;
                        }
                        if (lVar34 <= lVar52) {
                          return;
                        }
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar41->data;
                        pvVar13 = pgVar42->data;
                        do {
                          lVar33 = lVar52 / lVar35;
                          lVar38 = lVar52 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar53 = 0;
                            do {
                              fVar69 = expf(*(float *)((long)pvVar13 +
                                                      lVar53 * 4 +
                                                      lVar55 * sVar7 +
                                                      lVar38 * sVar6 + lVar33 * sVar8));
                              *(float *)((long)pvVar9 +
                                        lVar53 * 4 +
                                        lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                   fVar69;
                              lVar53 = lVar53 + 1;
                            } while (lVar36 != lVar53);
                          }
                          lVar52 = lVar52 + 1;
                        } while (lVar52 != lVar34);
                        return;
                      }
LAB_0012dd7a:
                      pcVar37 = "nb00 == sizeof(src0_t)";
                      uVar40 = 0x56;
                      goto LAB_0012dd94;
                    }
                  }
                  else if ((gVar2 == GGML_TYPE_F16) && (pgVar41->type == GGML_TYPE_F16)) {
                    cVar30 = ggml_is_contiguous_1(pgVar42);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                      if (pgVar41->nb[0] == 2) {
                        if (pgVar42->nb[0] == 2) {
                          lVar39 = pgVar42->ne[1];
                          lVar35 = pgVar42->ne[2];
                          sVar6 = pgVar42->nb[1];
                          sVar7 = pgVar42->nb[2];
                          sVar8 = pgVar42->nb[3];
                          lVar36 = pgVar41->ne[0];
                          gVar2 = pgVar43->type;
                          iVar3 = *(int *)&pgVar43->field_0x4;
                          lVar33 = ggml_nrows(pgVar42);
                          lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                          lVar52 = (int)gVar2 * lVar34;
                          lVar34 = lVar34 + lVar52;
                          if (lVar33 <= lVar34) {
                            lVar34 = lVar33;
                          }
                          if (lVar34 <= lVar52) {
                            return;
                          }
                          lVar35 = lVar35 * lVar39;
                          pvVar9 = pgVar42->data;
                          do {
                            lVar33 = lVar52 % lVar35;
                            if (0 < lVar36) {
                              lVar55 = 0;
                              do {
                                auVar61._0_4_ =
                                     expf(*(float *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)pvVar9 +
                                                            lVar55 * 2 +
                                                            (lVar33 / lVar39) * sVar7 +
                                                            (lVar33 % lVar39) * sVar6 +
                                                            (lVar52 / lVar35) * sVar8) * 4));
                                auVar61._4_60_ = extraout_var_00;
                                auVar70 = vcvtps2ph_f16c(auVar61._0_16_,0);
                                vpextrw_avx(auVar70,0);
                                lVar55 = lVar55 + 1;
                              } while (lVar36 != lVar55);
                            }
                            lVar52 = lVar52 + 1;
                          } while (lVar52 != lVar34);
                          return;
                        }
                        goto LAB_0012dd7a;
                      }
                      goto LAB_0012dd5e;
                    }
                  }
                  else if (gVar2 == GGML_TYPE_BF16) {
                    gVar5 = pgVar41->type;
                    in_RCX = (ulong)gVar5;
                    if (gVar5 == GGML_TYPE_F32) {
                      cVar30 = ggml_is_contiguous_1(pgVar42);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                        if (pgVar41->nb[0] == 4) {
                          if (pgVar42->nb[0] == 2) {
                            lVar39 = pgVar42->ne[1];
                            lVar35 = pgVar42->ne[2];
                            sVar6 = pgVar42->nb[1];
                            sVar7 = pgVar42->nb[2];
                            sVar8 = pgVar42->nb[3];
                            lVar36 = pgVar41->ne[0];
                            sVar10 = pgVar41->nb[1];
                            sVar11 = pgVar41->nb[2];
                            sVar12 = pgVar41->nb[3];
                            gVar2 = pgVar43->type;
                            iVar3 = *(int *)&pgVar43->field_0x4;
                            lVar33 = ggml_nrows(pgVar42);
                            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                            lVar52 = (int)gVar2 * lVar34;
                            lVar34 = lVar34 + lVar52;
                            if (lVar33 <= lVar34) {
                              lVar34 = lVar33;
                            }
                            if (lVar34 <= lVar52) {
                              return;
                            }
                            lVar35 = lVar35 * lVar39;
                            pvVar9 = pgVar41->data;
                            pvVar13 = pgVar42->data;
                            do {
                              lVar33 = lVar52 / lVar35;
                              lVar38 = lVar52 % lVar35;
                              lVar55 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar53 = 0;
                                do {
                                  fVar69 = expf((float)((uint)*(ushort *)
                                                               ((long)pvVar13 +
                                                               lVar53 * 2 +
                                                               lVar55 * sVar7 +
                                                               lVar38 * sVar6 + lVar33 * sVar8) <<
                                                       0x10));
                                  *(float *)((long)pvVar9 +
                                            lVar53 * 4 +
                                            lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                       fVar69;
                                  lVar53 = lVar53 + 1;
                                } while (lVar36 != lVar53);
                              }
                              lVar52 = lVar52 + 1;
                            } while (lVar52 != lVar34);
                            return;
                          }
                          goto LAB_0012dd7a;
                        }
                        goto LAB_0012dd5e;
                      }
                    }
                    else {
                      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012d87b;
                      cVar30 = ggml_is_contiguous_1(pgVar42);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                        if (pgVar41->nb[0] == 2) {
                          if (pgVar42->nb[0] == 2) {
                            lVar39 = pgVar42->ne[1];
                            lVar35 = pgVar42->ne[2];
                            sVar6 = pgVar42->nb[1];
                            sVar7 = pgVar42->nb[2];
                            sVar8 = pgVar42->nb[3];
                            lVar36 = pgVar41->ne[0];
                            sVar10 = pgVar41->nb[1];
                            sVar11 = pgVar41->nb[2];
                            sVar12 = pgVar41->nb[3];
                            gVar2 = pgVar43->type;
                            iVar3 = *(int *)&pgVar43->field_0x4;
                            lVar33 = ggml_nrows(pgVar42);
                            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                            lVar52 = (int)gVar2 * lVar34;
                            lVar34 = lVar34 + lVar52;
                            if (lVar33 <= lVar34) {
                              lVar34 = lVar33;
                            }
                            if (lVar34 <= lVar52) {
                              return;
                            }
                            lVar35 = lVar35 * lVar39;
                            pvVar9 = pgVar41->data;
                            pvVar13 = pgVar42->data;
                            do {
                              lVar33 = lVar52 / lVar35;
                              lVar38 = lVar52 % lVar35;
                              lVar55 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar53 = 0;
                                do {
                                  fVar69 = expf((float)((uint)*(ushort *)
                                                               ((long)pvVar13 +
                                                               lVar53 * 2 +
                                                               lVar55 * sVar7 +
                                                               lVar38 * sVar6 + lVar33 * sVar8) <<
                                                       0x10));
                                  if ((uint)ABS(fVar69) < 0x7f800001) {
                                    uVar31 = (ushort)((int)fVar69 + 0x7fff +
                                                      ((uint)fVar69 >> 0x10 & 1) >> 0x10);
                                  }
                                  else {
                                    uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                                  }
                                  *(ushort *)
                                   ((long)pvVar9 +
                                   lVar53 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12)
                                       = uVar31;
                                  lVar53 = lVar53 + 1;
                                } while (lVar36 != lVar53);
                              }
                              lVar52 = lVar52 + 1;
                            } while (lVar52 != lVar34);
                            return;
                          }
                          goto LAB_0012dd7a;
                        }
                        goto LAB_0012dd5e;
                      }
                    }
                  }
                  else {
LAB_0012d87b:
                    if ((gVar2 != GGML_TYPE_F16) || (pgVar41->type != GGML_TYPE_F32)) {
                      ggml_compute_forward_exp_cold_1();
                      pgVar14 = pgVar42->src[0];
                      gVar2 = pgVar14->type;
                      if ((gVar2 == GGML_TYPE_F32) && (pgVar42->type == GGML_TYPE_F32)) {
                        cVar30 = ggml_is_contiguous_1(pgVar14);
                        if (((cVar30 != '\0') &&
                            (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                           (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0')) {
                          if (pgVar42->nb[0] != 4) goto LAB_0012e6c9;
                          if (pgVar14->nb[0] == 4) {
                            lVar39 = pgVar14->ne[1];
                            lVar35 = pgVar14->ne[2];
                            sVar6 = pgVar14->nb[1];
                            sVar7 = pgVar14->nb[2];
                            sVar8 = pgVar14->nb[3];
                            lVar36 = pgVar42->ne[0];
                            sVar10 = pgVar42->nb[1];
                            sVar11 = pgVar42->nb[2];
                            sVar12 = pgVar42->nb[3];
                            gVar2 = pgVar41->type;
                            iVar3 = *(int *)&pgVar41->field_0x4;
                            lVar33 = ggml_nrows(pgVar14);
                            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                            lVar52 = (int)gVar2 * lVar34;
                            lVar34 = lVar34 + lVar52;
                            if (lVar33 <= lVar34) {
                              lVar34 = lVar33;
                            }
                            if (lVar34 <= lVar52) {
                              return;
                            }
                            lVar35 = lVar35 * lVar39;
                            pvVar9 = pgVar42->data;
                            pvVar13 = pgVar14->data;
                            do {
                              lVar33 = lVar52 / lVar35;
                              lVar38 = lVar52 % lVar35;
                              lVar55 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar53 = 0;
                                do {
                                  fVar69 = *(float *)((long)pvVar13 +
                                                     lVar53 * 4 +
                                                     lVar55 * sVar7 +
                                                     lVar38 * sVar6 + lVar33 * sVar8);
                                  auVar79._0_4_ = (fVar69 + 3.0) / 6.0;
                                  auVar79._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                  auVar70 = vmaxss_avx(auVar79,ZEXT816(0) << 0x40);
                                  auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                                  *(float *)((long)pvVar9 +
                                            lVar53 * 4 +
                                            lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                       fVar69 * auVar70._0_4_;
                                  lVar53 = lVar53 + 1;
                                } while (lVar36 != lVar53);
                              }
                              lVar52 = lVar52 + 1;
                            } while (lVar52 != lVar34);
                            return;
                          }
LAB_0012e6e5:
                          pcVar37 = "nb00 == sizeof(src0_t)";
                          uVar40 = 0x56;
                          goto LAB_0012e6ff;
                        }
                      }
                      else if ((gVar2 == GGML_TYPE_F16) && (pgVar42->type == GGML_TYPE_F16)) {
                        cVar30 = ggml_is_contiguous_1(pgVar14);
                        if (((cVar30 != '\0') &&
                            (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                           (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0')) {
                          if (pgVar42->nb[0] == 2) {
                            if (pgVar14->nb[0] == 2) {
                              lVar39 = pgVar14->ne[1];
                              lVar35 = pgVar14->ne[2];
                              sVar6 = pgVar14->nb[1];
                              sVar7 = pgVar14->nb[2];
                              sVar8 = pgVar14->nb[3];
                              lVar36 = pgVar42->ne[0];
                              gVar2 = pgVar41->type;
                              iVar3 = *(int *)&pgVar41->field_0x4;
                              lVar33 = ggml_nrows();
                              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                              lVar52 = (int)gVar2 * lVar34;
                              lVar34 = lVar34 + lVar52;
                              if (lVar33 <= lVar34) {
                                lVar34 = lVar33;
                              }
                              if (lVar34 <= lVar52) {
                                return;
                              }
                              lVar35 = lVar35 * lVar39;
                              do {
                                lVar33 = lVar52 % lVar35;
                                if (0 < lVar36) {
                                  lVar55 = 0;
                                  do {
                                    auVar77._0_4_ =
                                         (*(float *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)pgVar14->data +
                                                            lVar55 * 2 +
                                                            (lVar33 / lVar39) * sVar7 +
                                                            (lVar33 % lVar39) * sVar6 +
                                                            (lVar52 / lVar35) * sVar8) * 4) + 3.0) /
                                         6.0;
                                    auVar77._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                    auVar70 = vmaxss_avx(auVar77,ZEXT816(0) << 0x40);
                                    auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                                    auVar70 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar14->data +
                                                          lVar55 * 2 +
                                                          (lVar33 / lVar39) * sVar7 +
                                                          (lVar33 % lVar39) * sVar6 +
                                                          (lVar52 / lVar35) * sVar8) * 4) *
                                                  auVar70._0_4_)),0);
                                    vpextrw_avx(auVar70,0);
                                    lVar55 = lVar55 + 1;
                                  } while (lVar36 != lVar55);
                                }
                                lVar52 = lVar52 + 1;
                              } while (lVar52 != lVar34);
                              return;
                            }
                            goto LAB_0012e6e5;
                          }
                          goto LAB_0012e6c9;
                        }
                      }
                      else if (gVar2 == GGML_TYPE_BF16) {
                        gVar5 = pgVar42->type;
                        in_RCX = (ulong)gVar5;
                        if (gVar5 == GGML_TYPE_F32) {
                          cVar30 = ggml_is_contiguous_1(pgVar14);
                          if (((cVar30 != '\0') &&
                              (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                             (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0')) {
                            if (pgVar42->nb[0] == 4) {
                              if (pgVar14->nb[0] == 2) {
                                lVar39 = pgVar14->ne[1];
                                lVar35 = pgVar14->ne[2];
                                sVar6 = pgVar14->nb[1];
                                sVar7 = pgVar14->nb[2];
                                sVar8 = pgVar14->nb[3];
                                lVar36 = pgVar42->ne[0];
                                sVar10 = pgVar42->nb[1];
                                sVar11 = pgVar42->nb[2];
                                sVar12 = pgVar42->nb[3];
                                gVar2 = pgVar41->type;
                                iVar3 = *(int *)&pgVar41->field_0x4;
                                lVar33 = ggml_nrows(pgVar14);
                                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                                lVar52 = (int)gVar2 * lVar34;
                                lVar34 = lVar34 + lVar52;
                                if (lVar33 <= lVar34) {
                                  lVar34 = lVar33;
                                }
                                if (lVar34 <= lVar52) {
                                  return;
                                }
                                lVar35 = lVar35 * lVar39;
                                pvVar9 = pgVar42->data;
                                pvVar13 = pgVar14->data;
                                auVar68 = vpbroadcastq_avx512f();
                                auVar64 = vbroadcastss_avx512f(ZEXT416(0x40400000));
                                auVar65 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
                                auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                auVar61 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                do {
                                  lVar33 = lVar52 / lVar35;
                                  lVar38 = lVar52 % lVar35;
                                  lVar55 = lVar38 / lVar39;
                                  lVar38 = lVar38 % lVar39;
                                  if (0 < lVar36) {
                                    uVar51 = 0;
                                    do {
                                      auVar62 = vpbroadcastq_avx512f();
                                      auVar63 = vporq_avx512f(auVar62,auVar66);
                                      auVar62 = vporq_avx512f(auVar62,auVar67);
                                      uVar40 = vpcmpuq_avx512f(auVar62,auVar68,2);
                                      bVar28 = (byte)uVar40;
                                      uVar40 = vpcmpuq_avx512f(auVar63,auVar68,2);
                                      bVar29 = (byte)uVar40;
                                      uVar31 = CONCAT11(bVar29,bVar28);
                                      auVar60 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                                    ((long)pvVar13 +
                                                                    uVar51 * 2 +
                                                                    lVar55 * sVar7 +
                                                                    lVar38 * sVar6 + lVar33 * sVar8)
                                                                  );
                                      auVar58._2_2_ =
                                           (ushort)((byte)(uVar31 >> 1) & 1) * auVar60._2_2_;
                                      auVar58._0_2_ = (ushort)(bVar28 & 1) * auVar60._0_2_;
                                      auVar58._4_2_ =
                                           (ushort)((byte)(uVar31 >> 2) & 1) * auVar60._4_2_;
                                      auVar58._6_2_ =
                                           (ushort)((byte)(uVar31 >> 3) & 1) * auVar60._6_2_;
                                      auVar58._8_2_ =
                                           (ushort)((byte)(uVar31 >> 4) & 1) * auVar60._8_2_;
                                      auVar58._10_2_ =
                                           (ushort)((byte)(uVar31 >> 5) & 1) * auVar60._10_2_;
                                      auVar58._12_2_ =
                                           (ushort)((byte)(uVar31 >> 6) & 1) * auVar60._12_2_;
                                      auVar58._14_2_ =
                                           (ushort)((byte)(uVar31 >> 7) & 1) * auVar60._14_2_;
                                      auVar58._16_2_ = (ushort)(bVar29 & 1) * auVar60._16_2_;
                                      auVar58._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar60._18_2_;
                                      auVar58._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar60._20_2_;
                                      auVar58._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar60._22_2_;
                                      auVar58._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar60._24_2_;
                                      auVar58._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar60._26_2_;
                                      auVar58._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar60._28_2_;
                                      auVar58._30_2_ = (ushort)(bVar29 >> 7) * auVar60._30_2_;
                                      auVar62 = vpmovzxwd_avx512f(auVar58);
                                      auVar62 = vpslld_avx512f(auVar62,0x10);
                                      auVar63 = vaddps_avx512f(auVar62,auVar64);
                                      auVar63 = vdivps_avx512f(auVar63,auVar65);
                                      auVar63 = vmaxps_avx512f(auVar63,ZEXT1664(ZEXT816(0) << 0x40))
                                      ;
                                      auVar63 = vminps_avx512f(auVar63,auVar61);
                                      auVar62 = vmulps_avx512f(auVar63,auVar62);
                                      puVar1 = (uint *)((long)pvVar9 +
                                                       uVar51 * 4 +
                                                       lVar55 * sVar11 +
                                                       lVar38 * sVar10 + lVar33 * sVar12);
                                      bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
                                      bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                                      bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
                                      bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                                      bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
                                      bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
                                      bVar21 = (bool)((byte)(uVar31 >> 7) & 1);
                                      bVar22 = (bool)(bVar29 >> 1 & 1);
                                      bVar23 = (bool)(bVar29 >> 2 & 1);
                                      bVar24 = (bool)(bVar29 >> 3 & 1);
                                      bVar25 = (bool)(bVar29 >> 4 & 1);
                                      bVar26 = (bool)(bVar29 >> 5 & 1);
                                      bVar27 = (bool)(bVar29 >> 6 & 1);
                                      *puVar1 = (uint)(bVar28 & 1) * auVar62._0_4_ |
                                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                                      puVar1[1] = (uint)bVar15 * auVar62._4_4_ |
                                                  (uint)!bVar15 * puVar1[1];
                                      puVar1[2] = (uint)bVar16 * auVar62._8_4_ |
                                                  (uint)!bVar16 * puVar1[2];
                                      puVar1[3] = (uint)bVar17 * auVar62._12_4_ |
                                                  (uint)!bVar17 * puVar1[3];
                                      puVar1[4] = (uint)bVar18 * auVar62._16_4_ |
                                                  (uint)!bVar18 * puVar1[4];
                                      puVar1[5] = (uint)bVar19 * auVar62._20_4_ |
                                                  (uint)!bVar19 * puVar1[5];
                                      puVar1[6] = (uint)bVar20 * auVar62._24_4_ |
                                                  (uint)!bVar20 * puVar1[6];
                                      puVar1[7] = (uint)bVar21 * auVar62._28_4_ |
                                                  (uint)!bVar21 * puVar1[7];
                                      puVar1[8] = (uint)(bVar29 & 1) * auVar62._32_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar22 * auVar62._36_4_ |
                                                  (uint)!bVar22 * puVar1[9];
                                      puVar1[10] = (uint)bVar23 * auVar62._40_4_ |
                                                   (uint)!bVar23 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar24 * auVar62._44_4_ |
                                                    (uint)!bVar24 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar25 * auVar62._48_4_ |
                                                    (uint)!bVar25 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar26 * auVar62._52_4_ |
                                                    (uint)!bVar26 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar27 * auVar62._56_4_ |
                                                    (uint)!bVar27 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar62._60_4_ |
                                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                      uVar51 = uVar51 + 0x10;
                                    } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar51);
                                  }
                                  lVar52 = lVar52 + 1;
                                } while (lVar52 != lVar34);
                                return;
                              }
                              goto LAB_0012e6e5;
                            }
                            goto LAB_0012e6c9;
                          }
                        }
                        else {
                          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012e170;
                          cVar30 = ggml_is_contiguous_1(pgVar14);
                          if (((cVar30 != '\0') &&
                              (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                             (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0')) {
                            if (pgVar42->nb[0] == 2) {
                              if (pgVar14->nb[0] == 2) {
                                lVar39 = pgVar14->ne[1];
                                lVar35 = pgVar14->ne[2];
                                sVar6 = pgVar14->nb[1];
                                sVar7 = pgVar14->nb[2];
                                sVar8 = pgVar14->nb[3];
                                lVar36 = pgVar42->ne[0];
                                sVar10 = pgVar42->nb[1];
                                sVar11 = pgVar42->nb[2];
                                sVar12 = pgVar42->nb[3];
                                gVar2 = pgVar41->type;
                                iVar3 = *(int *)&pgVar41->field_0x4;
                                lVar33 = ggml_nrows(pgVar14);
                                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                                lVar52 = (int)gVar2 * lVar34;
                                lVar34 = lVar34 + lVar52;
                                if (lVar33 <= lVar34) {
                                  lVar34 = lVar33;
                                }
                                if (lVar34 <= lVar52) {
                                  return;
                                }
                                lVar35 = lVar35 * lVar39;
                                pvVar9 = pgVar42->data;
                                pvVar13 = pgVar14->data;
                                do {
                                  lVar33 = lVar52 / lVar35;
                                  lVar38 = lVar52 % lVar35;
                                  lVar55 = lVar38 / lVar39;
                                  lVar38 = lVar38 % lVar39;
                                  if (0 < lVar36) {
                                    lVar53 = 0;
                                    do {
                                      fVar69 = (float)((uint)*(ushort *)
                                                              ((long)pvVar13 +
                                                              lVar53 * 2 +
                                                              lVar55 * sVar7 +
                                                              lVar38 * sVar6 + lVar33 * sVar8) <<
                                                      0x10);
                                      auVar78._0_4_ = (fVar69 + 3.0) / 6.0;
                                      auVar78._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                      auVar70 = vmaxss_avx(auVar78,ZEXT816(0) << 0x40);
                                      auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                                      fVar69 = auVar70._0_4_ * fVar69;
                                      if ((uint)ABS(fVar69) < 0x7f800001) {
                                        uVar31 = (ushort)((int)fVar69 + 0x7fff +
                                                          ((uint)fVar69 >> 0x10 & 1) >> 0x10);
                                      }
                                      else {
                                        uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                                      }
                                      *(ushort *)
                                       ((long)pvVar9 +
                                       lVar53 * 2 +
                                       lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) = uVar31
                                      ;
                                      lVar53 = lVar53 + 1;
                                    } while (lVar36 != lVar53);
                                  }
                                  lVar52 = lVar52 + 1;
                                } while (lVar52 != lVar34);
                                return;
                              }
                              goto LAB_0012e6e5;
                            }
                            goto LAB_0012e6c9;
                          }
                        }
                      }
                      else {
LAB_0012e170:
                        if ((gVar2 != GGML_TYPE_F16) || (pgVar42->type != GGML_TYPE_F32)) {
                          pgVar44 = pgVar14;
                          pgVar47 = pgVar42;
                          ggml_compute_forward_hardswish_cold_1();
                          pgVar49 = pgVar44->src[0];
                          gVar2 = pgVar49->type;
                          pgStack_338 = pgVar49;
                          pgStack_308 = pgVar44;
                          pgStack_300 = pgVar41;
                          pgStack_2f8 = pgVar42;
                          pgStack_2f0 = pgVar45;
                          pgStack_2e8 = pgVar14;
                          pgStack_2e0 = pgVar43;
                          if ((gVar2 == GGML_TYPE_F32) && (pgVar44->type == GGML_TYPE_F32)) {
                            pgStack_340 = (ggml_tensor *)0x12ec0c;
                            cVar30 = ggml_is_contiguous_1(pgVar49);
                            if (cVar30 != '\0') {
                              pgStack_340 = (ggml_tensor *)0x12ec1c;
                              cVar30 = ggml_is_contiguous_1(pgVar44);
                              if (cVar30 != '\0') {
                                pgStack_340 = (ggml_tensor *)0x12ec2f;
                                cVar30 = ggml_are_same_shape(pgVar49,pgVar44);
                                if (cVar30 != '\0') {
                                  if (pgVar44->nb[0] != 4) goto LAB_0012ef51;
                                  if (pgVar49->nb[0] == 4) {
                                    lVar39 = pgVar49->ne[1];
                                    lVar35 = pgVar49->ne[2];
                                    sStack_310 = pgVar49->nb[1];
                                    sStack_318 = pgVar49->nb[2];
                                    sStack_320 = pgVar49->nb[3];
                                    lVar36 = pgVar44->ne[0];
                                    sStack_328 = pgVar44->nb[1];
                                    sVar6 = pgVar44->nb[2];
                                    sVar7 = pgVar44->nb[3];
                                    gVar2 = pgVar47->type;
                                    sStack_330 = (size_t)*(int *)&pgVar47->field_0x4;
                                    pgStack_340 = (ggml_tensor *)0x12eca5;
                                    lVar33 = ggml_nrows();
                                    lVar34 = (long)(sStack_330 + -1 + lVar33) / (long)sStack_330;
                                    lVar52 = (int)gVar2 * lVar34;
                                    lVar34 = lVar34 + lVar52;
                                    if (lVar33 <= lVar34) {
                                      lVar34 = lVar33;
                                    }
                                    if (lVar34 <= lVar52) {
                                      return;
                                    }
                                    lVar35 = lVar35 * lVar39;
                                    pvVar9 = pgStack_308->data;
                                    pvVar13 = pgStack_338->data;
                                    do {
                                      lVar33 = lVar52 / lVar35;
                                      lVar38 = lVar52 % lVar35;
                                      lVar55 = lVar38 / lVar39;
                                      lVar38 = lVar38 % lVar39;
                                      if (0 < lVar36) {
                                        lVar53 = 0;
                                        do {
                                          fVar69 = *(float *)((long)pvVar13 +
                                                             lVar53 * 4 +
                                                             lVar55 * sStack_318 +
                                                             lVar38 * sStack_310 +
                                                             lVar33 * sStack_320);
                                          *(float *)((long)pvVar9 +
                                                    lVar53 * 4 +
                                                    lVar55 * sVar6 +
                                                    lVar38 * sStack_328 + lVar33 * sVar7) =
                                               fVar69 * fVar69;
                                          lVar53 = lVar53 + 1;
                                        } while (lVar36 != lVar53);
                                      }
                                      lVar52 = lVar52 + 1;
                                    } while (lVar52 != lVar34);
                                    return;
                                  }
LAB_0012ef6d:
                                  pcVar37 = "nb00 == sizeof(src0_t)";
                                  uVar40 = 0x56;
                                  goto LAB_0012ef87;
                                }
                              }
                            }
                          }
                          else if ((gVar2 == GGML_TYPE_F16) && (pgVar44->type == GGML_TYPE_F16)) {
                            pgStack_340 = (ggml_tensor *)0x12e75e;
                            cVar30 = ggml_is_contiguous_1(pgVar49);
                            if (cVar30 != '\0') {
                              pgStack_340 = (ggml_tensor *)0x12e76e;
                              cVar30 = ggml_is_contiguous_1(pgVar44);
                              if (cVar30 != '\0') {
                                pgStack_340 = (ggml_tensor *)0x12e781;
                                cVar30 = ggml_are_same_shape(pgVar49,pgVar44);
                                if (cVar30 != '\0') {
                                  if (pgVar44->nb[0] == 2) {
                                    if (pgVar49->nb[0] == 2) {
                                      lVar39 = pgVar49->ne[1];
                                      lVar35 = pgVar49->ne[2];
                                      sStack_310 = pgVar49->nb[1];
                                      sStack_318 = pgVar49->nb[2];
                                      sStack_320 = pgVar49->nb[3];
                                      lVar36 = pgVar44->ne[0];
                                      sStack_328 = pgVar44->nb[1];
                                      sStack_330 = pgVar44->nb[2];
                                      gVar2 = pgVar47->type;
                                      iVar3 = *(int *)&pgVar47->field_0x4;
                                      pgStack_340 = (ggml_tensor *)0x12e7f5;
                                      lVar33 = ggml_nrows();
                                      lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                                      lVar52 = (int)gVar2 * lVar34;
                                      lVar34 = lVar34 + lVar52;
                                      if (lVar33 <= lVar34) {
                                        lVar34 = lVar33;
                                      }
                                      if (lVar34 <= lVar52) {
                                        return;
                                      }
                                      lVar35 = lVar35 * lVar39;
                                      do {
                                        lVar33 = lVar52 % lVar35;
                                        if (0 < lVar36) {
                                          lVar55 = 0;
                                          do {
                                            auVar70 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgStack_338->data +
                                                          lVar55 * 2 +
                                                          (lVar33 / lVar39) * sStack_318 +
                                                          (lVar33 % lVar39) * sStack_310 +
                                                          (lVar52 / lVar35) * sStack_320) * 4) *
                                                  *(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pgStack_338->data +
                                                                    lVar55 * 2 +
                                                                    (lVar33 / lVar39) * sStack_318 +
                                                                    (lVar33 % lVar39) * sStack_310 +
                                                                    (lVar52 / lVar35) * sStack_320)
                                                            * 4))),0);
                                            vpextrw_avx(auVar70,0);
                                            lVar55 = lVar55 + 1;
                                          } while (lVar36 != lVar55);
                                        }
                                        lVar52 = lVar52 + 1;
                                      } while (lVar52 != lVar34);
                                      return;
                                    }
                                    goto LAB_0012ef6d;
                                  }
                                  goto LAB_0012ef51;
                                }
                              }
                            }
                          }
                          else if (gVar2 == GGML_TYPE_BF16) {
                            gVar5 = pgVar44->type;
                            in_RCX = (ulong)gVar5;
                            if (gVar5 == GGML_TYPE_F32) {
                              pgStack_340 = (ggml_tensor *)0x12ed6d;
                              cVar30 = ggml_is_contiguous_1(pgVar49);
                              if (cVar30 != '\0') {
                                pgStack_340 = (ggml_tensor *)0x12ed7d;
                                cVar30 = ggml_is_contiguous_1(pgVar44);
                                if (cVar30 != '\0') {
                                  pgStack_340 = (ggml_tensor *)0x12ed90;
                                  cVar30 = ggml_are_same_shape(pgVar49,pgVar44);
                                  if (cVar30 != '\0') {
                                    if (pgVar44->nb[0] == 4) {
                                      if (pgVar49->nb[0] == 2) {
                                        lVar39 = pgVar49->ne[1];
                                        lVar35 = pgVar49->ne[2];
                                        sStack_310 = pgVar49->nb[1];
                                        sStack_318 = pgVar49->nb[2];
                                        sStack_320 = pgVar49->nb[3];
                                        lVar36 = pgVar44->ne[0];
                                        sStack_328 = pgVar44->nb[1];
                                        sStack_330 = pgVar44->nb[2];
                                        pgStack_338 = (ggml_tensor *)pgVar44->nb[3];
                                        gVar2 = pgVar47->type;
                                        iVar3 = *(int *)&pgVar47->field_0x4;
                                        pgStack_340 = (ggml_tensor *)0x12ee09;
                                        lVar33 = ggml_nrows(pgVar49);
                                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                                        lVar52 = (int)gVar2 * lVar34;
                                        lVar34 = lVar34 + lVar52;
                                        if (lVar33 <= lVar34) {
                                          lVar34 = lVar33;
                                        }
                                        if (lVar34 <= lVar52) {
                                          return;
                                        }
                                        lVar35 = lVar35 * lVar39;
                                        pvVar9 = pgStack_308->data;
                                        pvVar13 = pgVar49->data;
                                        auVar68 = vpbroadcastq_avx512f();
                                        auVar64 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                        auVar65 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                        do {
                                          lVar33 = lVar52 / lVar35;
                                          lVar38 = lVar52 % lVar35;
                                          lVar55 = lVar38 / lVar39;
                                          lVar38 = lVar38 % lVar39;
                                          if (0 < lVar36) {
                                            uVar51 = 0;
                                            do {
                                              auVar66 = vpbroadcastq_avx512f();
                                              auVar67 = vporq_avx512f(auVar66,auVar64);
                                              auVar66 = vporq_avx512f(auVar66,auVar65);
                                              uVar40 = vpcmpuq_avx512f(auVar66,auVar68,2);
                                              bVar28 = (byte)uVar40;
                                              uVar40 = vpcmpuq_avx512f(auVar67,auVar68,2);
                                              bVar29 = (byte)uVar40;
                                              uVar31 = CONCAT11(bVar29,bVar28);
                                              auVar60 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                                            ((long)pvVar13 +
                                                                            uVar51 * 2 +
                                                                            lVar55 * sStack_318 +
                                                                            lVar38 * sStack_310 +
                                                                            lVar33 * sStack_320));
                                              auVar59._2_2_ =
                                                   (ushort)((byte)(uVar31 >> 1) & 1) * auVar60._2_2_
                                              ;
                                              auVar59._0_2_ = (ushort)(bVar28 & 1) * auVar60._0_2_;
                                              auVar59._4_2_ =
                                                   (ushort)((byte)(uVar31 >> 2) & 1) * auVar60._4_2_
                                              ;
                                              auVar59._6_2_ =
                                                   (ushort)((byte)(uVar31 >> 3) & 1) * auVar60._6_2_
                                              ;
                                              auVar59._8_2_ =
                                                   (ushort)((byte)(uVar31 >> 4) & 1) * auVar60._8_2_
                                              ;
                                              auVar59._10_2_ =
                                                   (ushort)((byte)(uVar31 >> 5) & 1) *
                                                   auVar60._10_2_;
                                              auVar59._12_2_ =
                                                   (ushort)((byte)(uVar31 >> 6) & 1) *
                                                   auVar60._12_2_;
                                              auVar59._14_2_ =
                                                   (ushort)((byte)(uVar31 >> 7) & 1) *
                                                   auVar60._14_2_;
                                              auVar59._16_2_ = (ushort)(bVar29 & 1) * auVar60._16_2_
                                              ;
                                              auVar59._18_2_ =
                                                   (ushort)(bVar29 >> 1 & 1) * auVar60._18_2_;
                                              auVar59._20_2_ =
                                                   (ushort)(bVar29 >> 2 & 1) * auVar60._20_2_;
                                              auVar59._22_2_ =
                                                   (ushort)(bVar29 >> 3 & 1) * auVar60._22_2_;
                                              auVar59._24_2_ =
                                                   (ushort)(bVar29 >> 4 & 1) * auVar60._24_2_;
                                              auVar59._26_2_ =
                                                   (ushort)(bVar29 >> 5 & 1) * auVar60._26_2_;
                                              auVar59._28_2_ =
                                                   (ushort)(bVar29 >> 6 & 1) * auVar60._28_2_;
                                              auVar59._30_2_ =
                                                   (ushort)(bVar29 >> 7) * auVar60._30_2_;
                                              auVar66 = vpmovzxwd_avx512f(auVar59);
                                              auVar66 = vpslld_avx512f(auVar66,0x10);
                                              auVar66 = vmulps_avx512f(auVar66,auVar66);
                                              puVar1 = (uint *)((long)pvVar9 +
                                                               uVar51 * 4 +
                                                               lVar55 * sStack_330 +
                                                               lVar38 * sStack_328 +
                                                               lVar33 * (long)pgStack_338);
                                              bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
                                              bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                                              bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
                                              bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                                              bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
                                              bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
                                              bVar21 = (bool)((byte)(uVar31 >> 7) & 1);
                                              bVar22 = (bool)(bVar29 >> 1 & 1);
                                              bVar23 = (bool)(bVar29 >> 2 & 1);
                                              bVar24 = (bool)(bVar29 >> 3 & 1);
                                              bVar25 = (bool)(bVar29 >> 4 & 1);
                                              bVar26 = (bool)(bVar29 >> 5 & 1);
                                              bVar27 = (bool)(bVar29 >> 6 & 1);
                                              *puVar1 = (uint)(bVar28 & 1) * auVar66._0_4_ |
                                                        (uint)!(bool)(bVar28 & 1) * *puVar1;
                                              puVar1[1] = (uint)bVar15 * auVar66._4_4_ |
                                                          (uint)!bVar15 * puVar1[1];
                                              puVar1[2] = (uint)bVar16 * auVar66._8_4_ |
                                                          (uint)!bVar16 * puVar1[2];
                                              puVar1[3] = (uint)bVar17 * auVar66._12_4_ |
                                                          (uint)!bVar17 * puVar1[3];
                                              puVar1[4] = (uint)bVar18 * auVar66._16_4_ |
                                                          (uint)!bVar18 * puVar1[4];
                                              puVar1[5] = (uint)bVar19 * auVar66._20_4_ |
                                                          (uint)!bVar19 * puVar1[5];
                                              puVar1[6] = (uint)bVar20 * auVar66._24_4_ |
                                                          (uint)!bVar20 * puVar1[6];
                                              puVar1[7] = (uint)bVar21 * auVar66._28_4_ |
                                                          (uint)!bVar21 * puVar1[7];
                                              puVar1[8] = (uint)(bVar29 & 1) * auVar66._32_4_ |
                                                          (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                              puVar1[9] = (uint)bVar22 * auVar66._36_4_ |
                                                          (uint)!bVar22 * puVar1[9];
                                              puVar1[10] = (uint)bVar23 * auVar66._40_4_ |
                                                           (uint)!bVar23 * puVar1[10];
                                              puVar1[0xb] = (uint)bVar24 * auVar66._44_4_ |
                                                            (uint)!bVar24 * puVar1[0xb];
                                              puVar1[0xc] = (uint)bVar25 * auVar66._48_4_ |
                                                            (uint)!bVar25 * puVar1[0xc];
                                              puVar1[0xd] = (uint)bVar26 * auVar66._52_4_ |
                                                            (uint)!bVar26 * puVar1[0xd];
                                              puVar1[0xe] = (uint)bVar27 * auVar66._56_4_ |
                                                            (uint)!bVar27 * puVar1[0xe];
                                              puVar1[0xf] = (uint)(bVar29 >> 7) * auVar66._60_4_ |
                                                            (uint)!(bool)(bVar29 >> 7) * puVar1[0xf]
                                              ;
                                              uVar51 = uVar51 + 0x10;
                                            } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar51)
                                            ;
                                          }
                                          lVar52 = lVar52 + 1;
                                        } while (lVar52 != lVar34);
                                        return;
                                      }
                                      goto LAB_0012ef6d;
                                    }
                                    goto LAB_0012ef51;
                                  }
                                }
                              }
                            }
                            else {
                              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012ea86;
                              pgStack_340 = (ggml_tensor *)0x12e8ef;
                              cVar30 = ggml_is_contiguous_1(pgVar49);
                              if (cVar30 != '\0') {
                                pgStack_340 = (ggml_tensor *)0x12e8ff;
                                cVar30 = ggml_is_contiguous_1(pgVar44);
                                if (cVar30 != '\0') {
                                  pgStack_340 = (ggml_tensor *)0x12e912;
                                  cVar30 = ggml_are_same_shape(pgVar49,pgVar44);
                                  if (cVar30 != '\0') {
                                    if (pgVar44->nb[0] == 2) {
                                      if (pgVar49->nb[0] == 2) {
                                        lVar39 = pgVar49->ne[1];
                                        lVar35 = pgVar49->ne[2];
                                        pgStack_338 = (ggml_tensor *)pgVar49->nb[1];
                                        sStack_310 = pgVar49->nb[2];
                                        sStack_318 = pgVar49->nb[3];
                                        lVar36 = pgVar44->ne[0];
                                        sStack_320 = pgVar44->nb[1];
                                        sStack_328 = pgVar44->nb[2];
                                        sStack_330 = pgVar44->nb[3];
                                        gVar2 = pgVar47->type;
                                        iVar3 = *(int *)&pgVar47->field_0x4;
                                        pgStack_340 = (ggml_tensor *)0x12e98b;
                                        lVar33 = ggml_nrows(pgVar49);
                                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                                        lVar52 = (int)gVar2 * lVar34;
                                        lVar34 = lVar34 + lVar52;
                                        if (lVar33 <= lVar34) {
                                          lVar34 = lVar33;
                                        }
                                        if (lVar34 <= lVar52) {
                                          return;
                                        }
                                        lVar35 = lVar35 * lVar39;
                                        pvVar9 = pgStack_308->data;
                                        pvVar13 = pgVar49->data;
                                        do {
                                          lVar33 = lVar52 / lVar35;
                                          lVar38 = lVar52 % lVar35;
                                          lVar55 = lVar38 / lVar39;
                                          lVar38 = lVar38 % lVar39;
                                          if (0 < lVar36) {
                                            lVar53 = 0;
                                            do {
                                              fVar69 = (float)((uint)*(ushort *)
                                                                      ((long)pvVar13 +
                                                                      lVar53 * 2 +
                                                                      lVar55 * sStack_310 +
                                                                      lVar38 * (long)pgStack_338 +
                                                                      lVar33 * sStack_318) << 0x10);
                                              fVar69 = fVar69 * fVar69;
                                              if ((uint)ABS(fVar69) < 0x7f800001) {
                                                uVar31 = (ushort)((int)fVar69 + 0x7fff +
                                                                  ((uint)fVar69 >> 0x10 & 1) >> 0x10
                                                                 );
                                              }
                                              else {
                                                uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                                              }
                                              *(ushort *)
                                               ((long)pvVar9 +
                                               lVar53 * 2 +
                                               lVar55 * sStack_328 +
                                               lVar38 * sStack_320 + lVar33 * sStack_330) = uVar31;
                                              lVar53 = lVar53 + 1;
                                            } while (lVar36 != lVar53);
                                          }
                                          lVar52 = lVar52 + 1;
                                        } while (lVar52 != lVar34);
                                        return;
                                      }
                                      goto LAB_0012ef6d;
                                    }
                                    goto LAB_0012ef51;
                                  }
                                }
                              }
                            }
                          }
                          else {
LAB_0012ea86:
                            if ((gVar2 != GGML_TYPE_F16) || (pgVar44->type != GGML_TYPE_F32)) {
                              pgStack_340 = (ggml_tensor *)ggml_compute_forward_sqrt;
                              pgVar41 = pgVar49;
                              pgVar48 = pgVar44;
                              ggml_compute_forward_sqr_cold_1();
                              pgVar42 = pgVar41->src[0];
                              gVar2 = pgVar42->type;
                              pgStack_380 = pgVar42;
                              pgStack_378 = pgVar41;
                              pgStack_368 = pgVar49;
                              pgStack_360 = pgVar44;
                              pgStack_358 = pgVar45;
                              pgStack_350 = pgVar14;
                              pgStack_348 = pgVar43;
                              pgStack_340 = pgVar47;
                              if ((gVar2 == GGML_TYPE_F32) && (pgVar41->type == GGML_TYPE_F32)) {
                                pgStack_3c8 = (ggml_tensor *)0x12f515;
                                cVar30 = ggml_is_contiguous_1(pgVar42);
                                if (cVar30 != '\0') {
                                  pgStack_3c8 = (ggml_tensor *)0x12f525;
                                  cVar30 = ggml_is_contiguous_1(pgVar41);
                                  if (cVar30 != '\0') {
                                    pgStack_3c8 = (ggml_tensor *)0x12f538;
                                    cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                    if (cVar30 != '\0') {
                                      if (pgVar41->nb[0] != 4) goto LAB_0012f851;
                                      if (pgVar42->nb[0] == 4) {
                                        lStack_3b8 = pgVar42->ne[1];
                                        lStack_3c0 = pgVar42->ne[2];
                                        sStack_388 = pgVar42->nb[1];
                                        sStack_390 = pgVar42->nb[2];
                                        sStack_398 = pgVar42->nb[3];
                                        lVar39 = pgVar41->ne[0];
                                        sStack_3a0 = pgVar41->nb[1];
                                        sStack_3a8 = pgVar41->nb[2];
                                        sStack_3b0 = pgVar41->nb[3];
                                        gVar2 = pgVar48->type;
                                        iVar3 = *(int *)&pgVar48->field_0x4;
                                        pgStack_3c8 = (ggml_tensor *)0x12f5b0;
                                        lVar36 = ggml_nrows(pgVar42);
                                        lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                        lVar34 = (int)gVar2 * lVar35;
                                        lVar35 = lVar35 + lVar34;
                                        if (lVar36 <= lVar35) {
                                          lVar35 = lVar36;
                                        }
                                        if (lVar35 <= lVar34) {
                                          return;
                                        }
                                        lStack_3c0 = lStack_3c0 * lStack_3b8;
                                        do {
                                          lVar36 = (lVar34 % lStack_3c0) / lStack_3b8;
                                          lVar33 = (lVar34 % lStack_3c0) % lStack_3b8;
                                          if (0 < lVar39) {
                                            lVar55 = (lVar34 / lStack_3c0) * sStack_3b0;
                                            lVar38 = lVar36 * sStack_3a8;
                                            lVar53 = lVar33 * sStack_3a0;
                                            lVar52 = (lVar34 / lStack_3c0) * sStack_398;
                                            lVar36 = lVar36 * sStack_390;
                                            lVar33 = lVar33 * sStack_388;
                                            pvVar9 = pgStack_378->data;
                                            pvVar13 = pgStack_380->data;
                                            lVar54 = 0;
                                            do {
                                              fVar69 = *(float *)((long)pvVar13 +
                                                                 lVar54 * 4 +
                                                                 lVar36 + lVar33 + lVar52);
                                              if (fVar69 < 0.0) {
                                                pgStack_3c8 = (ggml_tensor *)0x12f676;
                                                fVar69 = sqrtf(fVar69);
                                              }
                                              else {
                                                auVar70 = vsqrtss_avx(ZEXT416((uint)fVar69),
                                                                      ZEXT416((uint)fVar69));
                                                fVar69 = auVar70._0_4_;
                                              }
                                              *(float *)((long)pvVar9 +
                                                        lVar54 * 4 + lVar38 + lVar53 + lVar55) =
                                                   fVar69;
                                              lVar54 = lVar54 + 1;
                                            } while (lVar39 != lVar54);
                                          }
                                          lVar34 = lVar34 + 1;
                                        } while (lVar34 != lVar35);
                                        return;
                                      }
LAB_0012f86d:
                                      pcVar37 = "nb00 == sizeof(src0_t)";
                                      uVar40 = 0x56;
                                      goto LAB_0012f887;
                                    }
                                  }
                                }
                              }
                              else if ((gVar2 == GGML_TYPE_F16) && (pgVar41->type == GGML_TYPE_F16))
                              {
                                pgStack_3c8 = (ggml_tensor *)0x12efe9;
                                cVar30 = ggml_is_contiguous_1(pgVar42);
                                if (cVar30 != '\0') {
                                  pgStack_3c8 = (ggml_tensor *)0x12eff9;
                                  cVar30 = ggml_is_contiguous_1(pgVar41);
                                  if (cVar30 != '\0') {
                                    pgStack_3c8 = (ggml_tensor *)0x12f00c;
                                    cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                    if (cVar30 != '\0') {
                                      if (pgVar41->nb[0] == 2) {
                                        if (pgVar42->nb[0] == 2) {
                                          lStack_3b8 = pgVar42->ne[1];
                                          lStack_3c0 = pgVar42->ne[2];
                                          sStack_390 = pgVar42->nb[1];
                                          sStack_398 = pgVar42->nb[2];
                                          sStack_3a0 = pgVar42->nb[3];
                                          lVar39 = pgVar41->ne[0];
                                          sStack_3a8 = pgVar41->nb[1];
                                          sStack_3b0 = pgVar41->nb[2];
                                          sStack_370 = pgVar41->nb[3];
                                          gVar2 = pgVar48->type;
                                          iVar3 = *(int *)&pgVar48->field_0x4;
                                          pgStack_3c8 = (ggml_tensor *)0x12f084;
                                          lVar35 = ggml_nrows(pgVar42);
                                          lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                          lVar34 = (int)gVar2 * lVar36;
                                          sStack_388 = lVar36 + lVar34;
                                          if (lVar35 <= (long)sStack_388) {
                                            sStack_388 = lVar35;
                                          }
                                          if ((long)sStack_388 <= lVar34) {
                                            return;
                                          }
                                          lStack_3c0 = lStack_3c0 * lStack_3b8;
                                          do {
                                            if (0 < lVar39) {
                                              lVar36 = (lVar34 / lStack_3c0) * sStack_3a0;
                                              lVar35 = ((lVar34 % lStack_3c0) / lStack_3b8) *
                                                       sStack_398;
                                              lVar33 = ((lVar34 % lStack_3c0) % lStack_3b8) *
                                                       sStack_390;
                                              pvVar9 = pgStack_380->data;
                                              lVar52 = 0;
                                              do {
                                                fVar69 = *(float *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pvVar9 +
                                                                           lVar52 * 2 +
                                                                           lVar35 + lVar33 + lVar36)
                                                                   * 4);
                                                if (fVar69 < 0.0) {
                                                  pgStack_3c8 = (ggml_tensor *)0x12f158;
                                                  auVar67._0_4_ = sqrtf(fVar69);
                                                  auVar67._4_60_ = extraout_var_01;
                                                  auVar70 = auVar67._0_16_;
                                                }
                                                else {
                                                  auVar70 = vsqrtss_avx(ZEXT416((uint)fVar69),
                                                                        ZEXT416((uint)fVar69));
                                                }
                                                auVar70 = vcvtps2ph_f16c(auVar70,0);
                                                vpextrw_avx(auVar70,0);
                                                lVar52 = lVar52 + 1;
                                              } while (lVar39 != lVar52);
                                            }
                                            lVar34 = lVar34 + 1;
                                          } while (lVar34 != sStack_388);
                                          return;
                                        }
                                        goto LAB_0012f86d;
                                      }
                                      goto LAB_0012f851;
                                    }
                                  }
                                }
                              }
                              else if (gVar2 == GGML_TYPE_BF16) {
                                gVar5 = pgVar41->type;
                                in_RCX = (ulong)gVar5;
                                if (gVar5 == GGML_TYPE_F32) {
                                  pgStack_3c8 = (ggml_tensor *)0x12f6a2;
                                  cVar30 = ggml_is_contiguous_1(pgVar42);
                                  if (cVar30 != '\0') {
                                    pgStack_3c8 = (ggml_tensor *)0x12f6b2;
                                    cVar30 = ggml_is_contiguous_1(pgVar41);
                                    if (cVar30 != '\0') {
                                      pgStack_3c8 = (ggml_tensor *)0x12f6c5;
                                      cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                      if (cVar30 != '\0') {
                                        if (pgVar41->nb[0] == 4) {
                                          if (pgVar42->nb[0] == 2) {
                                            lStack_3b8 = pgVar42->ne[1];
                                            lStack_3c0 = pgVar42->ne[2];
                                            sStack_388 = pgVar42->nb[1];
                                            sStack_390 = pgVar42->nb[2];
                                            sStack_398 = pgVar42->nb[3];
                                            lVar39 = pgVar41->ne[0];
                                            sStack_3a0 = pgVar41->nb[1];
                                            sStack_3a8 = pgVar41->nb[2];
                                            sStack_3b0 = pgVar41->nb[3];
                                            gVar2 = pgVar48->type;
                                            iVar3 = *(int *)&pgVar48->field_0x4;
                                            pgStack_3c8 = (ggml_tensor *)0x12f73d;
                                            lVar36 = ggml_nrows(pgVar42);
                                            lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                            lVar34 = (int)gVar2 * lVar35;
                                            lVar35 = lVar35 + lVar34;
                                            if (lVar36 <= lVar35) {
                                              lVar35 = lVar36;
                                            }
                                            if (lVar35 <= lVar34) {
                                              return;
                                            }
                                            lStack_3c0 = lStack_3c0 * lStack_3b8;
                                            do {
                                              lVar36 = (lVar34 % lStack_3c0) / lStack_3b8;
                                              lVar33 = (lVar34 % lStack_3c0) % lStack_3b8;
                                              if (0 < lVar39) {
                                                lVar55 = (lVar34 / lStack_3c0) * sStack_3b0;
                                                lVar53 = lVar36 * sStack_3a8;
                                                lVar54 = lVar33 * sStack_3a0;
                                                lVar52 = (lVar34 / lStack_3c0) * sStack_398;
                                                lVar36 = lVar36 * sStack_390;
                                                lVar33 = lVar33 * sStack_388;
                                                pvVar9 = pgStack_378->data;
                                                pvVar13 = pgStack_380->data;
                                                lVar38 = 0;
                                                do {
                                                  uVar31 = *(ushort *)
                                                            ((long)pvVar13 +
                                                            lVar38 * 2 + lVar36 + lVar33 + lVar52);
                                                  fVar69 = (float)((uint)uVar31 << 0x10);
                                                  if (fVar69 < 0.0) {
                                                    pgStack_3c8 = (ggml_tensor *)0x12f807;
                                                    fVar69 = sqrtf(fVar69);
                                                  }
                                                  else {
                                                    auVar70 = ZEXT216(uVar31) << 0x10;
                                                    auVar70 = vsqrtss_avx(auVar70,auVar70);
                                                    fVar69 = auVar70._0_4_;
                                                  }
                                                  *(float *)((long)pvVar9 +
                                                            lVar38 * 4 + lVar53 + lVar54 + lVar55) =
                                                       fVar69;
                                                  lVar38 = lVar38 + 1;
                                                } while (lVar39 != lVar38);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != lVar35);
                                            return;
                                          }
                                          goto LAB_0012f86d;
                                        }
                                        goto LAB_0012f851;
                                      }
                                    }
                                  }
                                }
                                else {
                                  if (gVar5 != GGML_TYPE_BF16) goto LAB_0012f35e;
                                  pgStack_3c8 = (ggml_tensor *)0x12f1a9;
                                  cVar30 = ggml_is_contiguous_1(pgVar42);
                                  if (cVar30 != '\0') {
                                    pgStack_3c8 = (ggml_tensor *)0x12f1b9;
                                    cVar30 = ggml_is_contiguous_1(pgVar41);
                                    if (cVar30 != '\0') {
                                      pgStack_3c8 = (ggml_tensor *)0x12f1cc;
                                      cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                      if (cVar30 != '\0') {
                                        if (pgVar41->nb[0] == 2) {
                                          if (pgVar42->nb[0] == 2) {
                                            lStack_3b8 = pgVar42->ne[1];
                                            lStack_3c0 = pgVar42->ne[2];
                                            sStack_388 = pgVar42->nb[1];
                                            sStack_390 = pgVar42->nb[2];
                                            sStack_398 = pgVar42->nb[3];
                                            lVar39 = pgVar41->ne[0];
                                            sStack_3a0 = pgVar41->nb[1];
                                            sStack_3a8 = pgVar41->nb[2];
                                            sStack_3b0 = pgVar41->nb[3];
                                            gVar2 = pgVar48->type;
                                            iVar3 = *(int *)&pgVar48->field_0x4;
                                            pgStack_3c8 = (ggml_tensor *)0x12f244;
                                            lVar36 = ggml_nrows(pgVar42);
                                            lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                            lVar34 = (int)gVar2 * lVar35;
                                            lVar35 = lVar35 + lVar34;
                                            if (lVar36 <= lVar35) {
                                              lVar35 = lVar36;
                                            }
                                            if (lVar35 <= lVar34) {
                                              return;
                                            }
                                            lStack_3c0 = lStack_3c0 * lStack_3b8;
                                            do {
                                              lVar36 = (lVar34 % lStack_3c0) / lStack_3b8;
                                              lVar33 = (lVar34 % lStack_3c0) % lStack_3b8;
                                              if (0 < lVar39) {
                                                lVar55 = (lVar34 / lStack_3c0) * sStack_3b0;
                                                lVar53 = lVar36 * sStack_3a8;
                                                lVar38 = lVar33 * sStack_3a0;
                                                lVar52 = (lVar34 / lStack_3c0) * sStack_398;
                                                lVar36 = lVar36 * sStack_390;
                                                lVar33 = lVar33 * sStack_388;
                                                pvVar9 = pgStack_378->data;
                                                pvVar13 = pgStack_380->data;
                                                lVar54 = 0;
                                                do {
                                                  uVar31 = *(ushort *)
                                                            ((long)pvVar13 +
                                                            lVar54 * 2 + lVar36 + lVar33 + lVar52);
                                                  fVar69 = (float)((uint)uVar31 << 0x10);
                                                  if (fVar69 < 0.0) {
                                                    pgStack_3c8 = (ggml_tensor *)0x12f311;
                                                    fVar69 = sqrtf(fVar69);
                                                  }
                                                  else {
                                                    auVar70 = ZEXT216(uVar31) << 0x10;
                                                    auVar70 = vsqrtss_avx(auVar70,auVar70);
                                                    fVar69 = auVar70._0_4_;
                                                  }
                                                  if ((uint)ABS(fVar69) < 0x7f800001) {
                                                    uVar31 = (ushort)((int)fVar69 + 0x7fff +
                                                                      ((uint)fVar69 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar9 +
                                                   lVar54 * 2 + lVar53 + lVar38 + lVar55) = uVar31;
                                                  lVar54 = lVar54 + 1;
                                                } while (lVar39 != lVar54);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != lVar35);
                                            return;
                                          }
                                          goto LAB_0012f86d;
                                        }
                                        goto LAB_0012f851;
                                      }
                                    }
                                  }
                                }
                              }
                              else {
LAB_0012f35e:
                                if ((gVar2 != GGML_TYPE_F16) || (pgVar41->type != GGML_TYPE_F32)) {
                                  pgStack_3c8 = (ggml_tensor *)ggml_compute_forward_sin;
                                  pgVar43 = pgVar42;
                                  pgVar49 = pgVar41;
                                  ggml_compute_forward_sqrt_cold_1();
                                  pgVar45 = pgVar43->src[0];
                                  gVar2 = pgVar45->type;
                                  pgStack_408 = pgVar45;
                                  pgStack_400 = pgVar43;
                                  pgStack_3f0 = pgVar41;
                                  pgStack_3e8 = pgVar44;
                                  pgStack_3e0 = pgVar42;
                                  pgStack_3d8 = pgVar14;
                                  pgStack_3d0 = pgVar48;
                                  pgStack_3c8 = pgVar47;
                                  if ((gVar2 == GGML_TYPE_F32) && (pgVar43->type == GGML_TYPE_F32))
                                  {
                                    pgStack_450 = (ggml_tensor *)0x12fdd1;
                                    cVar30 = ggml_is_contiguous_1(pgVar45);
                                    if (cVar30 != '\0') {
                                      pgStack_450 = (ggml_tensor *)0x12fde1;
                                      cVar30 = ggml_is_contiguous_1(pgVar43);
                                      if (cVar30 != '\0') {
                                        pgStack_450 = (ggml_tensor *)0x12fdf4;
                                        cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                        if (cVar30 != '\0') {
                                          if (pgVar43->nb[0] != 4) goto LAB_001300dd;
                                          if (pgVar45->nb[0] == 4) {
                                            lStack_440 = pgVar45->ne[1];
                                            lStack_448 = pgVar45->ne[2];
                                            sStack_410 = pgVar45->nb[1];
                                            sStack_418 = pgVar45->nb[2];
                                            sStack_420 = pgVar45->nb[3];
                                            lVar39 = pgVar43->ne[0];
                                            sStack_428 = pgVar43->nb[1];
                                            sStack_430 = pgVar43->nb[2];
                                            sStack_438 = pgVar43->nb[3];
                                            gVar2 = pgVar49->type;
                                            iVar3 = *(int *)&pgVar49->field_0x4;
                                            pgStack_450 = (ggml_tensor *)0x12fe6c;
                                            lVar36 = ggml_nrows(pgVar45);
                                            lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                            lVar34 = (int)gVar2 * lVar35;
                                            lVar35 = lVar35 + lVar34;
                                            if (lVar36 <= lVar35) {
                                              lVar35 = lVar36;
                                            }
                                            if (lVar35 <= lVar34) {
                                              return;
                                            }
                                            lStack_448 = lStack_448 * lStack_440;
                                            do {
                                              lVar36 = (lVar34 % lStack_448) / lStack_440;
                                              lVar33 = (lVar34 % lStack_448) % lStack_440;
                                              if (0 < lVar39) {
                                                lVar55 = (lVar34 / lStack_448) * sStack_438;
                                                lVar38 = lVar36 * sStack_430;
                                                lVar53 = lVar33 * sStack_428;
                                                lVar52 = (lVar34 / lStack_448) * sStack_420;
                                                lVar36 = lVar36 * sStack_418;
                                                lVar33 = lVar33 * sStack_410;
                                                pvVar9 = pgStack_400->data;
                                                pvVar13 = pgStack_408->data;
                                                lVar54 = 0;
                                                do {
                                                  pgStack_450 = (ggml_tensor *)0x12ff1e;
                                                  fVar69 = sinf(*(float *)((long)pvVar13 +
                                                                          lVar54 * 4 +
                                                                          lVar36 + lVar33 + lVar52))
                                                  ;
                                                  *(float *)((long)pvVar9 +
                                                            lVar54 * 4 + lVar38 + lVar53 + lVar55) =
                                                       fVar69;
                                                  lVar54 = lVar54 + 1;
                                                } while (lVar39 != lVar54);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != lVar35);
                                            return;
                                          }
LAB_001300f9:
                                          pcVar37 = "nb00 == sizeof(src0_t)";
                                          uVar40 = 0x56;
                                          goto LAB_00130113;
                                        }
                                      }
                                    }
                                  }
                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                          (pgVar43->type == GGML_TYPE_F16)) {
                                    pgStack_450 = (ggml_tensor *)0x12f8e9;
                                    cVar30 = ggml_is_contiguous_1(pgVar45);
                                    if (cVar30 != '\0') {
                                      pgStack_450 = (ggml_tensor *)0x12f8f9;
                                      cVar30 = ggml_is_contiguous_1(pgVar43);
                                      if (cVar30 != '\0') {
                                        pgStack_450 = (ggml_tensor *)0x12f90c;
                                        cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                        if (cVar30 != '\0') {
                                          if (pgVar43->nb[0] == 2) {
                                            if (pgVar45->nb[0] == 2) {
                                              lStack_440 = pgVar45->ne[1];
                                              lStack_448 = pgVar45->ne[2];
                                              sStack_418 = pgVar45->nb[1];
                                              sStack_420 = pgVar45->nb[2];
                                              sStack_428 = pgVar45->nb[3];
                                              lVar39 = pgVar43->ne[0];
                                              sStack_430 = pgVar43->nb[1];
                                              sStack_438 = pgVar43->nb[2];
                                              sStack_3f8 = pgVar43->nb[3];
                                              gVar2 = pgVar49->type;
                                              iVar3 = *(int *)&pgVar49->field_0x4;
                                              pgStack_450 = (ggml_tensor *)0x12f984;
                                              lVar35 = ggml_nrows(pgVar45);
                                              lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                              lVar34 = (int)gVar2 * lVar36;
                                              sStack_410 = lVar36 + lVar34;
                                              if (lVar35 <= (long)sStack_410) {
                                                sStack_410 = lVar35;
                                              }
                                              if ((long)sStack_410 <= lVar34) {
                                                return;
                                              }
                                              lStack_448 = lStack_448 * lStack_440;
                                              do {
                                                if (0 < lVar39) {
                                                  lVar36 = (lVar34 / lStack_448) * sStack_428;
                                                  lVar35 = ((lVar34 % lStack_448) / lStack_440) *
                                                           sStack_420;
                                                  lVar33 = ((lVar34 % lStack_448) % lStack_440) *
                                                           sStack_418;
                                                  pvVar9 = pgStack_408->data;
                                                  lVar52 = 0;
                                                  do {
                                                    pgStack_450 = (ggml_tensor *)0x12fa44;
                                                    auVar66._0_4_ =
                                                         sinf(*(float *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pvVar9 +
                                                                                lVar52 * 2 +
                                                                                lVar35 + lVar33 + 
                                                  lVar36) * 4));
                                                  auVar66._4_60_ = extraout_var_02;
                                                  auVar70 = vcvtps2ph_f16c(auVar66._0_16_,0);
                                                  vpextrw_avx(auVar70,0);
                                                  lVar52 = lVar52 + 1;
                                                  } while (lVar39 != lVar52);
                                                }
                                                lVar34 = lVar34 + 1;
                                              } while (lVar34 != sStack_410);
                                              return;
                                            }
                                            goto LAB_001300f9;
                                          }
                                          goto LAB_001300dd;
                                        }
                                      }
                                    }
                                  }
                                  else if (gVar2 == GGML_TYPE_BF16) {
                                    gVar5 = pgVar43->type;
                                    in_RCX = (ulong)gVar5;
                                    if (gVar5 == GGML_TYPE_F32) {
                                      pgStack_450 = (ggml_tensor *)0x12ff46;
                                      cVar30 = ggml_is_contiguous_1(pgVar45);
                                      if (cVar30 != '\0') {
                                        pgStack_450 = (ggml_tensor *)0x12ff56;
                                        cVar30 = ggml_is_contiguous_1(pgVar43);
                                        if (cVar30 != '\0') {
                                          pgStack_450 = (ggml_tensor *)0x12ff69;
                                          cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                          if (cVar30 != '\0') {
                                            if (pgVar43->nb[0] == 4) {
                                              if (pgVar45->nb[0] == 2) {
                                                lStack_440 = pgVar45->ne[1];
                                                lStack_448 = pgVar45->ne[2];
                                                sStack_410 = pgVar45->nb[1];
                                                sStack_418 = pgVar45->nb[2];
                                                sStack_420 = pgVar45->nb[3];
                                                lVar39 = pgVar43->ne[0];
                                                sStack_428 = pgVar43->nb[1];
                                                sStack_430 = pgVar43->nb[2];
                                                sStack_438 = pgVar43->nb[3];
                                                gVar2 = pgVar49->type;
                                                iVar3 = *(int *)&pgVar49->field_0x4;
                                                pgStack_450 = (ggml_tensor *)0x12ffe1;
                                                lVar36 = ggml_nrows(pgVar45);
                                                lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                                lVar34 = (int)gVar2 * lVar35;
                                                lVar35 = lVar35 + lVar34;
                                                if (lVar36 <= lVar35) {
                                                  lVar35 = lVar36;
                                                }
                                                if (lVar35 <= lVar34) {
                                                  return;
                                                }
                                                lStack_448 = lStack_448 * lStack_440;
                                                do {
                                                  lVar36 = (lVar34 % lStack_448) / lStack_440;
                                                  lVar33 = (lVar34 % lStack_448) % lStack_440;
                                                  if (0 < lVar39) {
                                                    lVar55 = (lVar34 / lStack_448) * sStack_438;
                                                    lVar53 = lVar36 * sStack_430;
                                                    lVar54 = lVar33 * sStack_428;
                                                    lVar52 = (lVar34 / lStack_448) * sStack_420;
                                                    lVar36 = lVar36 * sStack_418;
                                                    lVar33 = lVar33 * sStack_410;
                                                    pvVar9 = pgStack_400->data;
                                                    pvVar13 = pgStack_408->data;
                                                    lVar38 = 0;
                                                    do {
                                                      pgStack_450 = (ggml_tensor *)0x130097;
                                                      fVar69 = sinf((float)((uint)*(ushort *)
                                                                                   ((long)pvVar13 +
                                                                                   lVar38 * 2 +
                                                                                   lVar36 + lVar33 +
                                                                                            lVar52)
                                                                           << 0x10));
                                                      *(float *)((long)pvVar9 +
                                                                lVar38 * 4 +
                                                                lVar53 + lVar54 + lVar55) = fVar69;
                                                      lVar38 = lVar38 + 1;
                                                    } while (lVar39 != lVar38);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                } while (lVar34 != lVar35);
                                                return;
                                              }
                                              goto LAB_001300f9;
                                            }
                                            goto LAB_001300dd;
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012fc32;
                                      pgStack_450 = (ggml_tensor *)0x12fa91;
                                      cVar30 = ggml_is_contiguous_1(pgVar45);
                                      if (cVar30 != '\0') {
                                        pgStack_450 = (ggml_tensor *)0x12faa1;
                                        cVar30 = ggml_is_contiguous_1(pgVar43);
                                        if (cVar30 != '\0') {
                                          pgStack_450 = (ggml_tensor *)0x12fab4;
                                          cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                          if (cVar30 != '\0') {
                                            if (pgVar43->nb[0] == 2) {
                                              if (pgVar45->nb[0] == 2) {
                                                lStack_440 = pgVar45->ne[1];
                                                lStack_448 = pgVar45->ne[2];
                                                sStack_410 = pgVar45->nb[1];
                                                sStack_418 = pgVar45->nb[2];
                                                sStack_420 = pgVar45->nb[3];
                                                lVar39 = pgVar43->ne[0];
                                                sStack_428 = pgVar43->nb[1];
                                                sStack_430 = pgVar43->nb[2];
                                                sStack_438 = pgVar43->nb[3];
                                                gVar2 = pgVar49->type;
                                                iVar3 = *(int *)&pgVar49->field_0x4;
                                                pgStack_450 = (ggml_tensor *)0x12fb2c;
                                                lVar36 = ggml_nrows(pgVar45);
                                                lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                                lVar34 = (int)gVar2 * lVar35;
                                                lVar35 = lVar35 + lVar34;
                                                if (lVar36 <= lVar35) {
                                                  lVar35 = lVar36;
                                                }
                                                if (lVar35 <= lVar34) {
                                                  return;
                                                }
                                                lStack_448 = lStack_448 * lStack_440;
                                                do {
                                                  lVar36 = (lVar34 % lStack_448) / lStack_440;
                                                  lVar33 = (lVar34 % lStack_448) % lStack_440;
                                                  if (0 < lVar39) {
                                                    lVar55 = (lVar34 / lStack_448) * sStack_438;
                                                    lVar53 = lVar36 * sStack_430;
                                                    lVar38 = lVar33 * sStack_428;
                                                    lVar52 = (lVar34 / lStack_448) * sStack_420;
                                                    lVar36 = lVar36 * sStack_418;
                                                    lVar33 = lVar33 * sStack_410;
                                                    pvVar9 = pgStack_400->data;
                                                    pvVar13 = pgStack_408->data;
                                                    lVar54 = 0;
                                                    do {
                                                      pgStack_450 = (ggml_tensor *)0x12fbe9;
                                                      fVar69 = sinf((float)((uint)*(ushort *)
                                                                                   ((long)pvVar13 +
                                                                                   lVar54 * 2 +
                                                                                   lVar36 + lVar33 +
                                                                                            lVar52)
                                                                           << 0x10));
                                                      if ((uint)ABS(fVar69) < 0x7f800001) {
                                                        uVar31 = (ushort)((int)fVar69 + 0x7fff +
                                                                          ((uint)fVar69 >> 0x10 & 1)
                                                                         >> 0x10);
                                                      }
                                                      else {
                                                        uVar31 = (ushort)((uint)fVar69 >> 0x10) |
                                                                 0x40;
                                                      }
                                                      *(ushort *)
                                                       ((long)pvVar9 +
                                                       lVar54 * 2 + lVar53 + lVar38 + lVar55) =
                                                           uVar31;
                                                      lVar54 = lVar54 + 1;
                                                    } while (lVar39 != lVar54);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                } while (lVar34 != lVar35);
                                                return;
                                              }
                                              goto LAB_001300f9;
                                            }
                                            goto LAB_001300dd;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  else {
LAB_0012fc32:
                                    if ((gVar2 != GGML_TYPE_F16) || (pgVar43->type != GGML_TYPE_F32)
                                       ) {
                                      pgStack_450 = (ggml_tensor *)ggml_compute_forward_cos;
                                      pgVar41 = pgVar45;
                                      pgVar48 = pgVar43;
                                      ggml_compute_forward_sin_cold_1();
                                      pgVar42 = pgVar41->src[0];
                                      gVar2 = pgVar42->type;
                                      pgStack_490 = pgVar42;
                                      pgStack_488 = pgVar41;
                                      pgStack_478 = pgVar43;
                                      pgStack_470 = pgVar44;
                                      pgStack_468 = pgVar45;
                                      pgStack_460 = pgVar14;
                                      pgStack_458 = pgVar49;
                                      pgStack_450 = pgVar47;
                                      if ((gVar2 == GGML_TYPE_F32) &&
                                         (pgVar41->type == GGML_TYPE_F32)) {
                                        pgStack_4d8 = (ggml_tensor *)0x13065d;
                                        cVar30 = ggml_is_contiguous_1(pgVar42);
                                        if (cVar30 != '\0') {
                                          pgStack_4d8 = (ggml_tensor *)0x13066d;
                                          cVar30 = ggml_is_contiguous_1(pgVar41);
                                          if (cVar30 != '\0') {
                                            pgStack_4d8 = (ggml_tensor *)0x130680;
                                            cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                            if (cVar30 != '\0') {
                                              if (pgVar41->nb[0] != 4) goto LAB_00130969;
                                              if (pgVar42->nb[0] == 4) {
                                                lStack_4c8 = pgVar42->ne[1];
                                                lStack_4d0 = pgVar42->ne[2];
                                                sStack_498 = pgVar42->nb[1];
                                                sStack_4a0 = pgVar42->nb[2];
                                                sStack_4a8 = pgVar42->nb[3];
                                                lVar39 = pgVar41->ne[0];
                                                sStack_4b0 = pgVar41->nb[1];
                                                sStack_4b8 = pgVar41->nb[2];
                                                sStack_4c0 = pgVar41->nb[3];
                                                gVar2 = pgVar48->type;
                                                iVar3 = *(int *)&pgVar48->field_0x4;
                                                pgStack_4d8 = (ggml_tensor *)0x1306f8;
                                                lVar36 = ggml_nrows(pgVar42);
                                                lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                                lVar34 = (int)gVar2 * lVar35;
                                                lVar35 = lVar35 + lVar34;
                                                if (lVar36 <= lVar35) {
                                                  lVar35 = lVar36;
                                                }
                                                if (lVar35 <= lVar34) {
                                                  return;
                                                }
                                                lStack_4d0 = lStack_4d0 * lStack_4c8;
                                                do {
                                                  lVar36 = (lVar34 % lStack_4d0) / lStack_4c8;
                                                  lVar33 = (lVar34 % lStack_4d0) % lStack_4c8;
                                                  if (0 < lVar39) {
                                                    lVar55 = (lVar34 / lStack_4d0) * sStack_4c0;
                                                    lVar38 = lVar36 * sStack_4b8;
                                                    lVar53 = lVar33 * sStack_4b0;
                                                    lVar52 = (lVar34 / lStack_4d0) * sStack_4a8;
                                                    lVar36 = lVar36 * sStack_4a0;
                                                    lVar33 = lVar33 * sStack_498;
                                                    pvVar9 = pgStack_488->data;
                                                    pvVar13 = pgStack_490->data;
                                                    lVar54 = 0;
                                                    do {
                                                      pgStack_4d8 = (ggml_tensor *)0x1307aa;
                                                      fVar69 = cosf(*(float *)((long)pvVar13 +
                                                                              lVar54 * 4 +
                                                                              lVar36 + lVar33 + 
                                                  lVar52));
                                                  *(float *)((long)pvVar9 +
                                                            lVar54 * 4 + lVar38 + lVar53 + lVar55) =
                                                       fVar69;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar39 != lVar54);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                } while (lVar34 != lVar35);
                                                return;
                                              }
LAB_00130985:
                                              pcVar37 = "nb00 == sizeof(src0_t)";
                                              uVar40 = 0x56;
                                              goto LAB_0013099f;
                                            }
                                          }
                                        }
                                      }
                                      else if ((gVar2 == GGML_TYPE_F16) &&
                                              (pgVar41->type == GGML_TYPE_F16)) {
                                        pgStack_4d8 = (ggml_tensor *)0x130175;
                                        cVar30 = ggml_is_contiguous_1(pgVar42);
                                        if (cVar30 != '\0') {
                                          pgStack_4d8 = (ggml_tensor *)0x130185;
                                          cVar30 = ggml_is_contiguous_1(pgVar41);
                                          if (cVar30 != '\0') {
                                            pgStack_4d8 = (ggml_tensor *)0x130198;
                                            cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                            if (cVar30 != '\0') {
                                              if (pgVar41->nb[0] == 2) {
                                                if (pgVar42->nb[0] == 2) {
                                                  lStack_4c8 = pgVar42->ne[1];
                                                  lStack_4d0 = pgVar42->ne[2];
                                                  sStack_4a0 = pgVar42->nb[1];
                                                  sStack_4a8 = pgVar42->nb[2];
                                                  sStack_4b0 = pgVar42->nb[3];
                                                  lVar39 = pgVar41->ne[0];
                                                  sStack_4b8 = pgVar41->nb[1];
                                                  sStack_4c0 = pgVar41->nb[2];
                                                  sStack_480 = pgVar41->nb[3];
                                                  gVar2 = pgVar48->type;
                                                  iVar3 = *(int *)&pgVar48->field_0x4;
                                                  pgStack_4d8 = (ggml_tensor *)0x130210;
                                                  lVar35 = ggml_nrows(pgVar42);
                                                  lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3
                                                  ;
                                                  lVar34 = (int)gVar2 * lVar36;
                                                  sStack_498 = lVar36 + lVar34;
                                                  if (lVar35 <= (long)sStack_498) {
                                                    sStack_498 = lVar35;
                                                  }
                                                  if ((long)sStack_498 <= lVar34) {
                                                    return;
                                                  }
                                                  lStack_4d0 = lStack_4d0 * lStack_4c8;
                                                  do {
                                                    if (0 < lVar39) {
                                                      lVar36 = (lVar34 / lStack_4d0) * sStack_4b0;
                                                      lVar35 = ((lVar34 % lStack_4d0) / lStack_4c8)
                                                               * sStack_4a8;
                                                      lVar33 = ((lVar34 % lStack_4d0) % lStack_4c8)
                                                               * sStack_4a0;
                                                      pvVar9 = pgStack_490->data;
                                                      lVar52 = 0;
                                                      do {
                                                        pgStack_4d8 = (ggml_tensor *)0x1302d0;
                                                        auVar65._0_4_ =
                                                             cosf(*(float *)(&ggml_table_f32_f16 +
                                                                            (ulong)*(ushort *)
                                                                                    ((long)pvVar9 +
                                                                                    lVar52 * 2 +
                                                                                    lVar35 + lVar33 
                                                  + lVar36) * 4));
                                                  auVar65._4_60_ = extraout_var_03;
                                                  auVar70 = vcvtps2ph_f16c(auVar65._0_16_,0);
                                                  vpextrw_avx(auVar70,0);
                                                  lVar52 = lVar52 + 1;
                                                  } while (lVar39 != lVar52);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != sStack_498);
                                                  return;
                                                }
                                                goto LAB_00130985;
                                              }
                                              goto LAB_00130969;
                                            }
                                          }
                                        }
                                      }
                                      else if (gVar2 == GGML_TYPE_BF16) {
                                        gVar5 = pgVar41->type;
                                        in_RCX = (ulong)gVar5;
                                        if (gVar5 == GGML_TYPE_F32) {
                                          pgStack_4d8 = (ggml_tensor *)0x1307d2;
                                          cVar30 = ggml_is_contiguous_1(pgVar42);
                                          if (cVar30 != '\0') {
                                            pgStack_4d8 = (ggml_tensor *)0x1307e2;
                                            cVar30 = ggml_is_contiguous_1(pgVar41);
                                            if (cVar30 != '\0') {
                                              pgStack_4d8 = (ggml_tensor *)0x1307f5;
                                              cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                              if (cVar30 != '\0') {
                                                if (pgVar41->nb[0] == 4) {
                                                  if (pgVar42->nb[0] == 2) {
                                                    lStack_4c8 = pgVar42->ne[1];
                                                    lStack_4d0 = pgVar42->ne[2];
                                                    sStack_498 = pgVar42->nb[1];
                                                    sStack_4a0 = pgVar42->nb[2];
                                                    sStack_4a8 = pgVar42->nb[3];
                                                    lVar39 = pgVar41->ne[0];
                                                    sStack_4b0 = pgVar41->nb[1];
                                                    sStack_4b8 = pgVar41->nb[2];
                                                    sStack_4c0 = pgVar41->nb[3];
                                                    gVar2 = pgVar48->type;
                                                    iVar3 = *(int *)&pgVar48->field_0x4;
                                                    pgStack_4d8 = (ggml_tensor *)0x13086d;
                                                    lVar36 = ggml_nrows(pgVar42);
                                                    lVar35 = ((long)iVar3 + -1 + lVar36) /
                                                             (long)iVar3;
                                                    lVar34 = (int)gVar2 * lVar35;
                                                    lVar35 = lVar35 + lVar34;
                                                    if (lVar36 <= lVar35) {
                                                      lVar35 = lVar36;
                                                    }
                                                    if (lVar35 <= lVar34) {
                                                      return;
                                                    }
                                                    lStack_4d0 = lStack_4d0 * lStack_4c8;
                                                    do {
                                                      lVar36 = (lVar34 % lStack_4d0) / lStack_4c8;
                                                      lVar33 = (lVar34 % lStack_4d0) % lStack_4c8;
                                                      if (0 < lVar39) {
                                                        lVar55 = (lVar34 / lStack_4d0) * sStack_4c0;
                                                        lVar53 = lVar36 * sStack_4b8;
                                                        lVar54 = lVar33 * sStack_4b0;
                                                        lVar52 = (lVar34 / lStack_4d0) * sStack_4a8;
                                                        lVar36 = lVar36 * sStack_4a0;
                                                        lVar33 = lVar33 * sStack_498;
                                                        pvVar9 = pgStack_488->data;
                                                        pvVar13 = pgStack_490->data;
                                                        lVar38 = 0;
                                                        do {
                                                          pgStack_4d8 = (ggml_tensor *)0x130923;
                                                          fVar69 = cosf((float)((uint)*(ushort *)
                                                                                       ((long)
                                                  pvVar13 + lVar38 * 2 + lVar36 + lVar33 + lVar52)
                                                  << 0x10));
                                                  *(float *)((long)pvVar9 +
                                                            lVar38 * 4 + lVar53 + lVar54 + lVar55) =
                                                       fVar69;
                                                  lVar38 = lVar38 + 1;
                                                  } while (lVar39 != lVar38);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != lVar35);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                }
                                                goto LAB_00130969;
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          if (gVar5 != GGML_TYPE_BF16) goto LAB_001304be;
                                          pgStack_4d8 = (ggml_tensor *)0x13031d;
                                          cVar30 = ggml_is_contiguous_1(pgVar42);
                                          if (cVar30 != '\0') {
                                            pgStack_4d8 = (ggml_tensor *)0x13032d;
                                            cVar30 = ggml_is_contiguous_1(pgVar41);
                                            if (cVar30 != '\0') {
                                              pgStack_4d8 = (ggml_tensor *)0x130340;
                                              cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                              if (cVar30 != '\0') {
                                                if (pgVar41->nb[0] == 2) {
                                                  if (pgVar42->nb[0] == 2) {
                                                    lStack_4c8 = pgVar42->ne[1];
                                                    lStack_4d0 = pgVar42->ne[2];
                                                    sStack_498 = pgVar42->nb[1];
                                                    sStack_4a0 = pgVar42->nb[2];
                                                    sStack_4a8 = pgVar42->nb[3];
                                                    lVar39 = pgVar41->ne[0];
                                                    sStack_4b0 = pgVar41->nb[1];
                                                    sStack_4b8 = pgVar41->nb[2];
                                                    sStack_4c0 = pgVar41->nb[3];
                                                    gVar2 = pgVar48->type;
                                                    iVar3 = *(int *)&pgVar48->field_0x4;
                                                    pgStack_4d8 = (ggml_tensor *)0x1303b8;
                                                    lVar36 = ggml_nrows(pgVar42);
                                                    lVar35 = ((long)iVar3 + -1 + lVar36) /
                                                             (long)iVar3;
                                                    lVar34 = (int)gVar2 * lVar35;
                                                    lVar35 = lVar35 + lVar34;
                                                    if (lVar36 <= lVar35) {
                                                      lVar35 = lVar36;
                                                    }
                                                    if (lVar35 <= lVar34) {
                                                      return;
                                                    }
                                                    lStack_4d0 = lStack_4d0 * lStack_4c8;
                                                    do {
                                                      lVar36 = (lVar34 % lStack_4d0) / lStack_4c8;
                                                      lVar33 = (lVar34 % lStack_4d0) % lStack_4c8;
                                                      if (0 < lVar39) {
                                                        lVar55 = (lVar34 / lStack_4d0) * sStack_4c0;
                                                        lVar53 = lVar36 * sStack_4b8;
                                                        lVar38 = lVar33 * sStack_4b0;
                                                        lVar52 = (lVar34 / lStack_4d0) * sStack_4a8;
                                                        lVar36 = lVar36 * sStack_4a0;
                                                        lVar33 = lVar33 * sStack_498;
                                                        pvVar9 = pgStack_488->data;
                                                        pvVar13 = pgStack_490->data;
                                                        lVar54 = 0;
                                                        do {
                                                          pgStack_4d8 = (ggml_tensor *)0x130475;
                                                          fVar69 = cosf((float)((uint)*(ushort *)
                                                                                       ((long)
                                                  pvVar13 + lVar54 * 2 + lVar36 + lVar33 + lVar52)
                                                  << 0x10));
                                                  if ((uint)ABS(fVar69) < 0x7f800001) {
                                                    uVar31 = (ushort)((int)fVar69 + 0x7fff +
                                                                      ((uint)fVar69 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar9 +
                                                   lVar54 * 2 + lVar53 + lVar38 + lVar55) = uVar31;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar39 != lVar54);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != lVar35);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                }
                                                goto LAB_00130969;
                                              }
                                            }
                                          }
                                        }
                                      }
                                      else {
LAB_001304be:
                                        if ((gVar2 != GGML_TYPE_F16) ||
                                           (pgVar41->type != GGML_TYPE_F32)) {
                                          pgStack_4d8 = (ggml_tensor *)ggml_compute_forward_log;
                                          pgVar43 = pgVar42;
                                          pgVar49 = pgVar41;
                                          ggml_compute_forward_cos_cold_1();
                                          pgVar45 = pgVar43->src[0];
                                          gVar2 = pgVar45->type;
                                          pgStack_518 = pgVar45;
                                          pgStack_510 = pgVar43;
                                          pgStack_500 = pgVar41;
                                          pgStack_4f8 = pgVar44;
                                          pgStack_4f0 = pgVar42;
                                          pgStack_4e8 = pgVar14;
                                          pgStack_4e0 = pgVar48;
                                          pgStack_4d8 = pgVar47;
                                          if ((gVar2 == GGML_TYPE_F32) &&
                                             (pgVar43->type == GGML_TYPE_F32)) {
                                            pgStack_560 = (ggml_tensor *)0x130ee9;
                                            cVar30 = ggml_is_contiguous_1(pgVar45);
                                            if (cVar30 != '\0') {
                                              pgStack_560 = (ggml_tensor *)0x130ef9;
                                              cVar30 = ggml_is_contiguous_1(pgVar43);
                                              if (cVar30 != '\0') {
                                                pgStack_560 = (ggml_tensor *)0x130f0c;
                                                cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                                if (cVar30 != '\0') {
                                                  if (pgVar43->nb[0] != 4) goto LAB_001311f5;
                                                  if (pgVar45->nb[0] == 4) {
                                                    lStack_550 = pgVar45->ne[1];
                                                    lStack_558 = pgVar45->ne[2];
                                                    sStack_520 = pgVar45->nb[1];
                                                    sStack_528 = pgVar45->nb[2];
                                                    sStack_530 = pgVar45->nb[3];
                                                    lVar39 = pgVar43->ne[0];
                                                    sStack_538 = pgVar43->nb[1];
                                                    sStack_540 = pgVar43->nb[2];
                                                    sStack_548 = pgVar43->nb[3];
                                                    gVar2 = pgVar49->type;
                                                    iVar3 = *(int *)&pgVar49->field_0x4;
                                                    pgStack_560 = (ggml_tensor *)0x130f84;
                                                    lVar36 = ggml_nrows(pgVar45);
                                                    lVar35 = ((long)iVar3 + -1 + lVar36) /
                                                             (long)iVar3;
                                                    lVar34 = (int)gVar2 * lVar35;
                                                    lVar35 = lVar35 + lVar34;
                                                    if (lVar36 <= lVar35) {
                                                      lVar35 = lVar36;
                                                    }
                                                    if (lVar35 <= lVar34) {
                                                      return;
                                                    }
                                                    lStack_558 = lStack_558 * lStack_550;
                                                    do {
                                                      lVar36 = (lVar34 % lStack_558) / lStack_550;
                                                      lVar33 = (lVar34 % lStack_558) % lStack_550;
                                                      if (0 < lVar39) {
                                                        lVar55 = (lVar34 / lStack_558) * sStack_548;
                                                        lVar38 = lVar36 * sStack_540;
                                                        lVar53 = lVar33 * sStack_538;
                                                        lVar52 = (lVar34 / lStack_558) * sStack_530;
                                                        lVar36 = lVar36 * sStack_528;
                                                        lVar33 = lVar33 * sStack_520;
                                                        pvVar9 = pgStack_510->data;
                                                        pvVar13 = pgStack_518->data;
                                                        lVar54 = 0;
                                                        do {
                                                          pgStack_560 = (ggml_tensor *)0x131036;
                                                          fVar69 = logf(*(float *)((long)pvVar13 +
                                                                                  lVar54 * 4 +
                                                                                  lVar36 + lVar33 + 
                                                  lVar52));
                                                  *(float *)((long)pvVar9 +
                                                            lVar54 * 4 + lVar38 + lVar53 + lVar55) =
                                                       fVar69;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar39 != lVar54);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != lVar35);
                                                  return;
                                                  }
LAB_00131211:
                                                  pcVar37 = "nb00 == sizeof(src0_t)";
                                                  uVar40 = 0x56;
                                                  goto LAB_0013122b;
                                                }
                                              }
                                            }
                                          }
                                          else if ((gVar2 == GGML_TYPE_F16) &&
                                                  (pgVar43->type == GGML_TYPE_F16)) {
                                            pgStack_560 = (ggml_tensor *)0x130a01;
                                            cVar30 = ggml_is_contiguous_1(pgVar45);
                                            if (cVar30 != '\0') {
                                              pgStack_560 = (ggml_tensor *)0x130a11;
                                              cVar30 = ggml_is_contiguous_1(pgVar43);
                                              if (cVar30 != '\0') {
                                                pgStack_560 = (ggml_tensor *)0x130a24;
                                                cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                                if (cVar30 != '\0') {
                                                  if (pgVar43->nb[0] == 2) {
                                                    if (pgVar45->nb[0] == 2) {
                                                      lStack_550 = pgVar45->ne[1];
                                                      lStack_558 = pgVar45->ne[2];
                                                      sStack_528 = pgVar45->nb[1];
                                                      sStack_530 = pgVar45->nb[2];
                                                      sStack_538 = pgVar45->nb[3];
                                                      lVar39 = pgVar43->ne[0];
                                                      sStack_540 = pgVar43->nb[1];
                                                      sStack_548 = pgVar43->nb[2];
                                                      sStack_508 = pgVar43->nb[3];
                                                      gVar2 = pgVar49->type;
                                                      iVar3 = *(int *)&pgVar49->field_0x4;
                                                      pgStack_560 = (ggml_tensor *)0x130a9c;
                                                      lVar35 = ggml_nrows(pgVar45);
                                                      lVar36 = ((long)iVar3 + -1 + lVar35) /
                                                               (long)iVar3;
                                                      lVar34 = (int)gVar2 * lVar36;
                                                      sStack_520 = lVar36 + lVar34;
                                                      if (lVar35 <= (long)sStack_520) {
                                                        sStack_520 = lVar35;
                                                      }
                                                      if ((long)sStack_520 <= lVar34) {
                                                        return;
                                                      }
                                                      lStack_558 = lStack_558 * lStack_550;
                                                      do {
                                                        if (0 < lVar39) {
                                                          lVar36 = (lVar34 / lStack_558) *
                                                                   sStack_538;
                                                          lVar35 = ((lVar34 % lStack_558) /
                                                                   lStack_550) * sStack_530;
                                                          lVar33 = ((lVar34 % lStack_558) %
                                                                   lStack_550) * sStack_528;
                                                          pvVar9 = pgStack_518->data;
                                                          lVar52 = 0;
                                                          do {
                                                            pgStack_560 = (ggml_tensor *)0x130b5c;
                                                            auVar64._0_4_ =
                                                                 logf(*(float *)(&ggml_table_f32_f16
                                                                                + (ulong)*(ushort *)
                                                                                          ((long)
                                                  pvVar9 + lVar52 * 2 + lVar35 + lVar33 + lVar36) *
                                                  4));
                                                  auVar64._4_60_ = extraout_var_04;
                                                  auVar70 = vcvtps2ph_f16c(auVar64._0_16_,0);
                                                  vpextrw_avx(auVar70,0);
                                                  lVar52 = lVar52 + 1;
                                                  } while (lVar39 != lVar52);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != sStack_520);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                }
                                              }
                                            }
                                          }
                                          else if (gVar2 == GGML_TYPE_BF16) {
                                            gVar5 = pgVar43->type;
                                            in_RCX = (ulong)gVar5;
                                            if (gVar5 == GGML_TYPE_F32) {
                                              pgStack_560 = (ggml_tensor *)0x13105e;
                                              cVar30 = ggml_is_contiguous_1(pgVar45);
                                              if (cVar30 != '\0') {
                                                pgStack_560 = (ggml_tensor *)0x13106e;
                                                cVar30 = ggml_is_contiguous_1(pgVar43);
                                                if (cVar30 != '\0') {
                                                  pgStack_560 = (ggml_tensor *)0x131081;
                                                  cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                                  if (cVar30 != '\0') {
                                                    if (pgVar43->nb[0] == 4) {
                                                      if (pgVar45->nb[0] == 2) {
                                                        lStack_550 = pgVar45->ne[1];
                                                        lStack_558 = pgVar45->ne[2];
                                                        sStack_520 = pgVar45->nb[1];
                                                        sStack_528 = pgVar45->nb[2];
                                                        sStack_530 = pgVar45->nb[3];
                                                        lVar39 = pgVar43->ne[0];
                                                        sStack_538 = pgVar43->nb[1];
                                                        sStack_540 = pgVar43->nb[2];
                                                        sStack_548 = pgVar43->nb[3];
                                                        gVar2 = pgVar49->type;
                                                        iVar3 = *(int *)&pgVar49->field_0x4;
                                                        pgStack_560 = (ggml_tensor *)0x1310f9;
                                                        lVar36 = ggml_nrows(pgVar45);
                                                        lVar35 = ((long)iVar3 + -1 + lVar36) /
                                                                 (long)iVar3;
                                                        lVar34 = (int)gVar2 * lVar35;
                                                        lVar35 = lVar35 + lVar34;
                                                        if (lVar36 <= lVar35) {
                                                          lVar35 = lVar36;
                                                        }
                                                        if (lVar35 <= lVar34) {
                                                          return;
                                                        }
                                                        lStack_558 = lStack_558 * lStack_550;
                                                        do {
                                                          lVar36 = (lVar34 % lStack_558) /
                                                                   lStack_550;
                                                          lVar33 = (lVar34 % lStack_558) %
                                                                   lStack_550;
                                                          if (0 < lVar39) {
                                                            lVar55 = (lVar34 / lStack_558) *
                                                                     sStack_548;
                                                            lVar53 = lVar36 * sStack_540;
                                                            lVar54 = lVar33 * sStack_538;
                                                            lVar52 = (lVar34 / lStack_558) *
                                                                     sStack_530;
                                                            lVar36 = lVar36 * sStack_528;
                                                            lVar33 = lVar33 * sStack_520;
                                                            pvVar9 = pgStack_510->data;
                                                            pvVar13 = pgStack_518->data;
                                                            lVar38 = 0;
                                                            do {
                                                              pgStack_560 = (ggml_tensor *)0x1311af;
                                                              fVar69 = logf((float)((uint)*(ushort *
                                                  )((long)pvVar13 +
                                                   lVar38 * 2 + lVar36 + lVar33 + lVar52) << 0x10));
                                                  *(float *)((long)pvVar9 +
                                                            lVar38 * 4 + lVar53 + lVar54 + lVar55) =
                                                       fVar69;
                                                  lVar38 = lVar38 + 1;
                                                  } while (lVar39 != lVar38);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != lVar35);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              if (gVar5 != GGML_TYPE_BF16) goto LAB_00130d4a;
                                              pgStack_560 = (ggml_tensor *)0x130ba9;
                                              cVar30 = ggml_is_contiguous_1(pgVar45);
                                              if (cVar30 != '\0') {
                                                pgStack_560 = (ggml_tensor *)0x130bb9;
                                                cVar30 = ggml_is_contiguous_1(pgVar43);
                                                if (cVar30 != '\0') {
                                                  pgStack_560 = (ggml_tensor *)0x130bcc;
                                                  cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                                  if (cVar30 != '\0') {
                                                    if (pgVar43->nb[0] == 2) {
                                                      if (pgVar45->nb[0] == 2) {
                                                        lStack_550 = pgVar45->ne[1];
                                                        lStack_558 = pgVar45->ne[2];
                                                        sStack_520 = pgVar45->nb[1];
                                                        sStack_528 = pgVar45->nb[2];
                                                        sStack_530 = pgVar45->nb[3];
                                                        lVar39 = pgVar43->ne[0];
                                                        sStack_538 = pgVar43->nb[1];
                                                        sStack_540 = pgVar43->nb[2];
                                                        sStack_548 = pgVar43->nb[3];
                                                        gVar2 = pgVar49->type;
                                                        iVar3 = *(int *)&pgVar49->field_0x4;
                                                        pgStack_560 = (ggml_tensor *)0x130c44;
                                                        lVar36 = ggml_nrows(pgVar45);
                                                        lVar35 = ((long)iVar3 + -1 + lVar36) /
                                                                 (long)iVar3;
                                                        lVar34 = (int)gVar2 * lVar35;
                                                        lVar35 = lVar35 + lVar34;
                                                        if (lVar36 <= lVar35) {
                                                          lVar35 = lVar36;
                                                        }
                                                        if (lVar35 <= lVar34) {
                                                          return;
                                                        }
                                                        lStack_558 = lStack_558 * lStack_550;
                                                        do {
                                                          lVar36 = (lVar34 % lStack_558) /
                                                                   lStack_550;
                                                          lVar33 = (lVar34 % lStack_558) %
                                                                   lStack_550;
                                                          if (0 < lVar39) {
                                                            lVar55 = (lVar34 / lStack_558) *
                                                                     sStack_548;
                                                            lVar53 = lVar36 * sStack_540;
                                                            lVar38 = lVar33 * sStack_538;
                                                            lVar52 = (lVar34 / lStack_558) *
                                                                     sStack_530;
                                                            lVar36 = lVar36 * sStack_528;
                                                            lVar33 = lVar33 * sStack_520;
                                                            pvVar9 = pgStack_510->data;
                                                            pvVar13 = pgStack_518->data;
                                                            lVar54 = 0;
                                                            do {
                                                              pgStack_560 = (ggml_tensor *)0x130d01;
                                                              fVar69 = logf((float)((uint)*(ushort *
                                                  )((long)pvVar13 +
                                                   lVar54 * 2 + lVar36 + lVar33 + lVar52) << 0x10));
                                                  if ((uint)ABS(fVar69) < 0x7f800001) {
                                                    uVar31 = (ushort)((int)fVar69 + 0x7fff +
                                                                      ((uint)fVar69 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar31 = (ushort)((uint)fVar69 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar9 +
                                                   lVar54 * 2 + lVar53 + lVar38 + lVar55) = uVar31;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar39 != lVar54);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != lVar35);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
LAB_00130d4a:
                                            if ((gVar2 != GGML_TYPE_F16) ||
                                               (pgVar43->type != GGML_TYPE_F32)) {
                                              pgStack_560 = (ggml_tensor *)0x13123d;
                                              pgVar42 = pgVar43;
                                              ggml_compute_forward_log_cold_1();
                                              pgStack_560 = pgVar47;
                                              pgStack_568 = pgVar14;
                                              pgStack_570 = pgVar43;
                                              uVar46 = (uint)pgVar42;
                                              uVar32 = uVar46 & 0xffffffc0;
                                              uStack_600 = 0;
                                              uStack_5f8 = 0;
                                              uStack_5f0 = 0;
                                              uStack_5e8 = 0;
                                              uStack_5e0 = 0;
                                              uStack_5d8 = 0;
                                              uStack_5d0 = 0;
                                              uStack_5c8 = 0;
                                              uStack_640 = 0;
                                              uStack_638 = 0;
                                              uStack_630 = 0;
                                              uStack_628 = 0;
                                              uStack_620 = 0;
                                              uStack_618 = 0;
                                              uStack_610 = 0;
                                              uStack_608 = 0;
                                              uStack_680 = 0;
                                              uStack_678 = 0;
                                              uStack_670 = 0;
                                              uStack_668 = 0;
                                              uStack_660 = 0;
                                              uStack_658 = 0;
                                              uStack_650 = 0;
                                              uStack_648 = 0;
                                              auStack_6c0 = ZEXT1664(ZEXT816(0));
                                              if (0 < (int)uVar32) {
                                                uVar50 = 0;
                                                lVar39 = in_R9;
                                                uVar51 = in_RCX;
                                                do {
                                                  lVar35 = 0;
                                                  do {
                                                    auVar68 = vfmadd213ps_avx512f(*(undefined1
                                                                                    (*) [64])
                                                                                   (lVar39 + lVar35)
                                                                                  ,*(undefined1
                                                                                     (*) [64])
                                                                                    (uVar51 + lVar35
                                                                                    ),*(undefined1
                                                                                        (*) [64])
                                                                                       (auStack_6c0
                                                                                       + lVar35));
                                                    *(undefined1 (*) [64])(auStack_6c0 + lVar35) =
                                                         auVar68;
                                                    lVar35 = lVar35 + 0x40;
                                                  } while (lVar35 != 0x100);
                                                  uVar50 = uVar50 + 0x40;
                                                  lVar39 = lVar39 + 0x100;
                                                  uVar51 = uVar51 + 0x100;
                                                } while (uVar50 < uVar32);
                                              }
                                              lVar39 = 0;
                                              do {
                                                auVar68 = vaddps_avx512f(*(undefined1 (*) [64])
                                                                          (auStack_6c0 + lVar39),
                                                                         *(undefined1 (*) [64])
                                                                          ((long)&uStack_640 +
                                                                          lVar39));
                                                *(undefined1 (*) [64])(auStack_6c0 + lVar39) =
                                                     auVar68;
                                                lVar39 = lVar39 + 0x40;
                                              } while (lVar39 == 0x40);
                                              auVar68._8_8_ = uStack_678;
                                              auVar68._0_8_ = uStack_680;
                                              auVar68._16_8_ = uStack_670;
                                              auVar68._24_8_ = uStack_668;
                                              auVar68._32_8_ = uStack_660;
                                              auVar68._40_8_ = uStack_658;
                                              auVar68._48_8_ = uStack_650;
                                              auVar68._56_8_ = uStack_648;
                                              auVar68 = vaddps_avx512f(auStack_6c0,auVar68);
                                              auVar60 = vextractf64x4_avx512f(auVar68,1);
                                              auVar68 = vaddps_avx512f(auVar68,ZEXT3264(auVar60));
                                              auVar71._0_4_ = auVar68._0_4_ + auVar68._16_4_;
                                              auVar71._4_4_ = auVar68._4_4_ + auVar68._20_4_;
                                              auVar71._8_4_ = auVar68._8_4_ + auVar68._24_4_;
                                              auVar71._12_4_ = auVar68._12_4_ + auVar68._28_4_;
                                              auVar70 = vshufpd_avx(auVar71,auVar71,1);
                                              auVar72._0_4_ = auVar71._0_4_ + auVar70._0_4_;
                                              auVar72._4_4_ = auVar71._4_4_ + auVar70._4_4_;
                                              auVar72._8_4_ = auVar71._8_4_ + auVar70._8_4_;
                                              auVar72._12_4_ = auVar71._12_4_ + auVar70._12_4_;
                                              auVar70 = vhaddps_avx(auVar72,auVar72);
                                              auVar68 = ZEXT1664(auVar70);
                                              if (uVar32 != uVar46) {
                                                lVar39 = (long)(int)uVar32;
                                                do {
                                                  auVar70 = vfmadd231ss_fma(auVar68._0_16_,
                                                                            ZEXT416(*(uint *)(in_RCX
                                                                                             + 
                                                  lVar39 * 4)),
                                                  ZEXT416(*(uint *)(in_R9 + lVar39 * 4)));
                                                  auVar68 = ZEXT1664(auVar70);
                                                  lVar39 = lVar39 + 1;
                                                } while (lVar39 < (int)uVar46);
                                              }
                                              pgVar45->type = auVar68._0_4_;
                                              return;
                                            }
                                            pgStack_560 = (ggml_tensor *)0x130d64;
                                            cVar30 = ggml_is_contiguous_1(pgVar45);
                                            if (cVar30 != '\0') {
                                              pgStack_560 = (ggml_tensor *)0x130d74;
                                              cVar30 = ggml_is_contiguous_1(pgVar43);
                                              if (cVar30 != '\0') {
                                                pgStack_560 = (ggml_tensor *)0x130d87;
                                                cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                                if (cVar30 != '\0') {
                                                  if (pgVar43->nb[0] == 4) {
                                                    if (pgVar45->nb[0] == 2) {
                                                      lStack_550 = pgVar45->ne[1];
                                                      lStack_558 = pgVar45->ne[2];
                                                      sStack_528 = pgVar45->nb[1];
                                                      sStack_530 = pgVar45->nb[2];
                                                      sStack_538 = pgVar45->nb[3];
                                                      lVar39 = pgVar43->ne[0];
                                                      sStack_540 = pgVar43->nb[1];
                                                      sStack_548 = pgVar43->nb[2];
                                                      sStack_508 = pgVar43->nb[3];
                                                      gVar2 = pgVar49->type;
                                                      iVar3 = *(int *)&pgVar49->field_0x4;
                                                      pgStack_560 = (ggml_tensor *)0x130dff;
                                                      lVar35 = ggml_nrows(pgVar45);
                                                      lVar36 = ((long)iVar3 + -1 + lVar35) /
                                                               (long)iVar3;
                                                      lVar34 = (int)gVar2 * lVar36;
                                                      sStack_520 = lVar36 + lVar34;
                                                      if (lVar35 <= (long)sStack_520) {
                                                        sStack_520 = lVar35;
                                                      }
                                                      if (lVar34 < (long)sStack_520) {
                                                        lStack_558 = lStack_558 * lStack_550;
                                                        do {
                                                          lVar35 = (lVar34 % lStack_558) /
                                                                   lStack_550;
                                                          lVar36 = (lVar34 % lStack_558) %
                                                                   lStack_550;
                                                          if (0 < lVar39) {
                                                            lVar52 = (lVar34 / lStack_558) *
                                                                     sStack_508;
                                                            lVar55 = lVar35 * sStack_548;
                                                            lVar38 = lVar36 * sStack_540;
                                                            lVar33 = (lVar34 / lStack_558) *
                                                                     sStack_538;
                                                            lVar35 = lVar35 * sStack_530;
                                                            lVar36 = lVar36 * sStack_528;
                                                            pvVar9 = pgStack_510->data;
                                                            pvVar13 = pgStack_518->data;
                                                            lVar53 = 0;
                                                            do {
                                                              pgStack_560 = (ggml_tensor *)0x130ebf;
                                                              fVar69 = logf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar53 * 2 + lVar35 + lVar36 + lVar33) * 4
                                                  ));
                                                  *(float *)((long)pvVar9 +
                                                            lVar53 * 4 + lVar55 + lVar38 + lVar52) =
                                                       fVar69;
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != sStack_520);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
LAB_001311f5:
                                                  pcVar37 = "nb0 == sizeof(dst_t)";
                                                  uVar40 = 0x55;
                                                  goto LAB_0013122b;
                                                }
                                              }
                                            }
                                          }
                                          pcVar37 = 
                                          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                          ;
                                          uVar40 = 0x51;
LAB_0013122b:
                                          pgStack_560 = (ggml_tensor *)0x131232;
                                          ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
                                        }
                                        pgStack_4d8 = (ggml_tensor *)0x1304d8;
                                        cVar30 = ggml_is_contiguous_1(pgVar42);
                                        if (cVar30 != '\0') {
                                          pgStack_4d8 = (ggml_tensor *)0x1304e8;
                                          cVar30 = ggml_is_contiguous_1(pgVar41);
                                          if (cVar30 != '\0') {
                                            pgStack_4d8 = (ggml_tensor *)0x1304fb;
                                            cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                            if (cVar30 != '\0') {
                                              if (pgVar41->nb[0] == 4) {
                                                if (pgVar42->nb[0] == 2) {
                                                  lStack_4c8 = pgVar42->ne[1];
                                                  lStack_4d0 = pgVar42->ne[2];
                                                  sStack_4a0 = pgVar42->nb[1];
                                                  sStack_4a8 = pgVar42->nb[2];
                                                  sStack_4b0 = pgVar42->nb[3];
                                                  lVar39 = pgVar41->ne[0];
                                                  sStack_4b8 = pgVar41->nb[1];
                                                  sStack_4c0 = pgVar41->nb[2];
                                                  sStack_480 = pgVar41->nb[3];
                                                  gVar2 = pgVar48->type;
                                                  iVar3 = *(int *)&pgVar48->field_0x4;
                                                  pgStack_4d8 = (ggml_tensor *)0x130573;
                                                  lVar35 = ggml_nrows(pgVar42);
                                                  lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3
                                                  ;
                                                  lVar34 = (int)gVar2 * lVar36;
                                                  sStack_498 = lVar36 + lVar34;
                                                  if (lVar35 <= (long)sStack_498) {
                                                    sStack_498 = lVar35;
                                                  }
                                                  if (lVar34 < (long)sStack_498) {
                                                    lStack_4d0 = lStack_4d0 * lStack_4c8;
                                                    do {
                                                      lVar35 = (lVar34 % lStack_4d0) / lStack_4c8;
                                                      lVar36 = (lVar34 % lStack_4d0) % lStack_4c8;
                                                      if (0 < lVar39) {
                                                        lVar52 = (lVar34 / lStack_4d0) * sStack_480;
                                                        lVar55 = lVar35 * sStack_4c0;
                                                        lVar38 = lVar36 * sStack_4b8;
                                                        lVar33 = (lVar34 / lStack_4d0) * sStack_4b0;
                                                        lVar35 = lVar35 * sStack_4a8;
                                                        lVar36 = lVar36 * sStack_4a0;
                                                        pvVar9 = pgStack_488->data;
                                                        pvVar13 = pgStack_490->data;
                                                        lVar53 = 0;
                                                        do {
                                                          pgStack_4d8 = (ggml_tensor *)0x130633;
                                                          fVar69 = cosf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar53 * 2 + lVar35 + lVar36 + lVar33) * 4
                                                  ));
                                                  *(float *)((long)pvVar9 +
                                                            lVar53 * 4 + lVar55 + lVar38 + lVar52) =
                                                       fVar69;
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar34 != sStack_498);
                                                  }
                                                  return;
                                                }
                                                goto LAB_00130985;
                                              }
LAB_00130969:
                                              pcVar37 = "nb0 == sizeof(dst_t)";
                                              uVar40 = 0x55;
                                              goto LAB_0013099f;
                                            }
                                          }
                                        }
                                      }
                                      pcVar37 = 
                                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                      ;
                                      uVar40 = 0x51;
LAB_0013099f:
                                      pgStack_4d8 = (ggml_tensor *)0x1309a6;
                                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                                 ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
                                    }
                                    pgStack_450 = (ggml_tensor *)0x12fc4c;
                                    cVar30 = ggml_is_contiguous_1(pgVar45);
                                    if (cVar30 != '\0') {
                                      pgStack_450 = (ggml_tensor *)0x12fc5c;
                                      cVar30 = ggml_is_contiguous_1(pgVar43);
                                      if (cVar30 != '\0') {
                                        pgStack_450 = (ggml_tensor *)0x12fc6f;
                                        cVar30 = ggml_are_same_shape(pgVar45,pgVar43);
                                        if (cVar30 != '\0') {
                                          if (pgVar43->nb[0] == 4) {
                                            if (pgVar45->nb[0] == 2) {
                                              lStack_440 = pgVar45->ne[1];
                                              lStack_448 = pgVar45->ne[2];
                                              sStack_418 = pgVar45->nb[1];
                                              sStack_420 = pgVar45->nb[2];
                                              sStack_428 = pgVar45->nb[3];
                                              lVar39 = pgVar43->ne[0];
                                              sStack_430 = pgVar43->nb[1];
                                              sStack_438 = pgVar43->nb[2];
                                              sStack_3f8 = pgVar43->nb[3];
                                              gVar2 = pgVar49->type;
                                              iVar3 = *(int *)&pgVar49->field_0x4;
                                              pgStack_450 = (ggml_tensor *)0x12fce7;
                                              lVar35 = ggml_nrows(pgVar45);
                                              lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                              lVar34 = (int)gVar2 * lVar36;
                                              sStack_410 = lVar36 + lVar34;
                                              if (lVar35 <= (long)sStack_410) {
                                                sStack_410 = lVar35;
                                              }
                                              if (lVar34 < (long)sStack_410) {
                                                lStack_448 = lStack_448 * lStack_440;
                                                do {
                                                  lVar35 = (lVar34 % lStack_448) / lStack_440;
                                                  lVar36 = (lVar34 % lStack_448) % lStack_440;
                                                  if (0 < lVar39) {
                                                    lVar52 = (lVar34 / lStack_448) * sStack_3f8;
                                                    lVar55 = lVar35 * sStack_438;
                                                    lVar38 = lVar36 * sStack_430;
                                                    lVar33 = (lVar34 / lStack_448) * sStack_428;
                                                    lVar35 = lVar35 * sStack_420;
                                                    lVar36 = lVar36 * sStack_418;
                                                    pvVar9 = pgStack_400->data;
                                                    pvVar13 = pgStack_408->data;
                                                    lVar53 = 0;
                                                    do {
                                                      pgStack_450 = (ggml_tensor *)0x12fda7;
                                                      fVar69 = sinf(*(float *)(&ggml_table_f32_f16 +
                                                                              (ulong)*(ushort *)
                                                                                      ((long)pvVar13
                                                                                      + lVar53 * 2 +
                                                                                        lVar35 + 
                                                  lVar36 + lVar33) * 4));
                                                  *(float *)((long)pvVar9 +
                                                            lVar53 * 4 + lVar55 + lVar38 + lVar52) =
                                                       fVar69;
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                } while (lVar34 != sStack_410);
                                              }
                                              return;
                                            }
                                            goto LAB_001300f9;
                                          }
LAB_001300dd:
                                          pcVar37 = "nb0 == sizeof(dst_t)";
                                          uVar40 = 0x55;
                                          goto LAB_00130113;
                                        }
                                      }
                                    }
                                  }
                                  pcVar37 = 
                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                  ;
                                  uVar40 = 0x51;
LAB_00130113:
                                  pgStack_450 = (ggml_tensor *)0x13011a;
                                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                             ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
                                }
                                pgStack_3c8 = (ggml_tensor *)0x12f378;
                                cVar30 = ggml_is_contiguous_1(pgVar42);
                                if (cVar30 != '\0') {
                                  pgStack_3c8 = (ggml_tensor *)0x12f388;
                                  cVar30 = ggml_is_contiguous_1(pgVar41);
                                  if (cVar30 != '\0') {
                                    pgStack_3c8 = (ggml_tensor *)0x12f39b;
                                    cVar30 = ggml_are_same_shape(pgVar42,pgVar41);
                                    if (cVar30 != '\0') {
                                      if (pgVar41->nb[0] == 4) {
                                        if (pgVar42->nb[0] == 2) {
                                          lStack_3b8 = pgVar42->ne[1];
                                          lStack_3c0 = pgVar42->ne[2];
                                          sStack_390 = pgVar42->nb[1];
                                          sStack_398 = pgVar42->nb[2];
                                          sStack_3a0 = pgVar42->nb[3];
                                          lVar39 = pgVar41->ne[0];
                                          sStack_3a8 = pgVar41->nb[1];
                                          sStack_3b0 = pgVar41->nb[2];
                                          sStack_370 = pgVar41->nb[3];
                                          gVar2 = pgVar48->type;
                                          iVar3 = *(int *)&pgVar48->field_0x4;
                                          pgStack_3c8 = (ggml_tensor *)0x12f413;
                                          lVar35 = ggml_nrows(pgVar42);
                                          lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                          lVar34 = (int)gVar2 * lVar36;
                                          sStack_388 = lVar36 + lVar34;
                                          if (lVar35 <= (long)sStack_388) {
                                            sStack_388 = lVar35;
                                          }
                                          if (lVar34 < (long)sStack_388) {
                                            lStack_3c0 = lStack_3c0 * lStack_3b8;
                                            do {
                                              lVar35 = (lVar34 % lStack_3c0) / lStack_3b8;
                                              lVar36 = (lVar34 % lStack_3c0) % lStack_3b8;
                                              if (0 < lVar39) {
                                                lVar52 = (lVar34 / lStack_3c0) * sStack_370;
                                                lVar55 = lVar35 * sStack_3b0;
                                                lVar38 = lVar36 * sStack_3a8;
                                                lVar33 = (lVar34 / lStack_3c0) * sStack_3a0;
                                                lVar35 = lVar35 * sStack_398;
                                                lVar36 = lVar36 * sStack_390;
                                                pvVar9 = pgStack_378->data;
                                                pvVar13 = pgStack_380->data;
                                                lVar53 = 0;
                                                do {
                                                  fVar69 = *(float *)(&ggml_table_f32_f16 +
                                                                     (ulong)*(ushort *)
                                                                             ((long)pvVar13 +
                                                                             lVar53 * 2 +
                                                                             lVar35 + lVar36 + 
                                                  lVar33) * 4);
                                                  if (fVar69 < 0.0) {
                                                    pgStack_3c8 = (ggml_tensor *)0x12f4e7;
                                                    fVar69 = sqrtf(fVar69);
                                                  }
                                                  else {
                                                    auVar70 = vsqrtss_avx(ZEXT416((uint)fVar69),
                                                                          ZEXT416((uint)fVar69));
                                                    fVar69 = auVar70._0_4_;
                                                  }
                                                  *(float *)((long)pvVar9 +
                                                            lVar53 * 4 + lVar55 + lVar38 + lVar52) =
                                                       fVar69;
                                                  lVar53 = lVar53 + 1;
                                                } while (lVar39 != lVar53);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != sStack_388);
                                          }
                                          return;
                                        }
                                        goto LAB_0012f86d;
                                      }
LAB_0012f851:
                                      pcVar37 = "nb0 == sizeof(dst_t)";
                                      uVar40 = 0x55;
                                      goto LAB_0012f887;
                                    }
                                  }
                                }
                              }
                              pcVar37 = 
                              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                              ;
                              uVar40 = 0x51;
LAB_0012f887:
                              pgStack_3c8 = (ggml_tensor *)0x12f88e;
                              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                         ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
                            }
                            pgStack_340 = (ggml_tensor *)0x12eaa2;
                            cVar30 = ggml_is_contiguous_1(pgVar49);
                            if (cVar30 != '\0') {
                              pgStack_340 = (ggml_tensor *)0x12eab2;
                              cVar30 = ggml_is_contiguous_1(pgVar44);
                              if (cVar30 != '\0') {
                                pgStack_340 = (ggml_tensor *)0x12eac5;
                                cVar30 = ggml_are_same_shape(pgVar49,pgVar44);
                                if (cVar30 != '\0') {
                                  if (pgVar44->nb[0] == 4) {
                                    if (pgVar49->nb[0] == 2) {
                                      lVar39 = pgVar49->ne[1];
                                      lVar35 = pgVar49->ne[2];
                                      sStack_310 = pgVar49->nb[1];
                                      sStack_318 = pgVar49->nb[2];
                                      sStack_320 = pgVar49->nb[3];
                                      lVar36 = pgVar44->ne[0];
                                      sStack_328 = pgVar44->nb[1];
                                      sStack_330 = pgVar44->nb[2];
                                      sVar6 = pgVar44->nb[3];
                                      gVar2 = pgVar47->type;
                                      pgStack_338 = (ggml_tensor *)(long)*(int *)&pgVar47->field_0x4
                                      ;
                                      pgStack_340 = (ggml_tensor *)0x12eb3b;
                                      lVar33 = ggml_nrows(pgVar49);
                                      lVar34 = ((long)pgStack_338 + -1 + lVar33) / (long)pgStack_338
                                      ;
                                      lVar52 = (int)gVar2 * lVar34;
                                      lVar34 = lVar34 + lVar52;
                                      if (lVar33 <= lVar34) {
                                        lVar34 = lVar33;
                                      }
                                      if (lVar52 < lVar34) {
                                        lVar35 = lVar35 * lVar39;
                                        pvVar9 = pgStack_308->data;
                                        pvVar13 = pgVar49->data;
                                        do {
                                          lVar33 = lVar52 / lVar35;
                                          lVar38 = lVar52 % lVar35;
                                          lVar55 = lVar38 / lVar39;
                                          lVar38 = lVar38 % lVar39;
                                          if (0 < lVar36) {
                                            lVar53 = 0;
                                            do {
                                              *(float *)((long)pvVar9 +
                                                        lVar53 * 4 +
                                                        lVar55 * sStack_330 +
                                                        lVar38 * sStack_328 + lVar33 * sVar6) =
                                                   *(float *)(&ggml_table_f32_f16 +
                                                             (ulong)*(ushort *)
                                                                     ((long)pvVar13 +
                                                                     lVar53 * 2 +
                                                                     lVar55 * sStack_318 +
                                                                     lVar38 * sStack_310 +
                                                                     lVar33 * sStack_320) * 4) *
                                                   *(float *)(&ggml_table_f32_f16 +
                                                             (ulong)*(ushort *)
                                                                     ((long)pvVar13 +
                                                                     lVar53 * 2 +
                                                                     lVar55 * sStack_318 +
                                                                     lVar38 * sStack_310 +
                                                                     lVar33 * sStack_320) * 4);
                                              lVar53 = lVar53 + 1;
                                            } while (lVar36 != lVar53);
                                          }
                                          lVar52 = lVar52 + 1;
                                        } while (lVar52 != lVar34);
                                      }
                                      return;
                                    }
                                    goto LAB_0012ef6d;
                                  }
LAB_0012ef51:
                                  pcVar37 = "nb0 == sizeof(dst_t)";
                                  uVar40 = 0x55;
                                  goto LAB_0012ef87;
                                }
                              }
                            }
                          }
                          pcVar37 = 
                          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                          ;
                          uVar40 = 0x51;
LAB_0012ef87:
                          pgStack_340 = (ggml_tensor *)0x12ef8e;
                          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                     ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
                        }
                        cVar30 = ggml_is_contiguous_1(pgVar14);
                        if (((cVar30 != '\0') &&
                            (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                           (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0')) {
                          if (pgVar42->nb[0] == 4) {
                            if (pgVar14->nb[0] == 2) {
                              lVar39 = pgVar14->ne[1];
                              lVar35 = pgVar14->ne[2];
                              sVar6 = pgVar14->nb[1];
                              sVar7 = pgVar14->nb[2];
                              sVar8 = pgVar14->nb[3];
                              lVar36 = pgVar42->ne[0];
                              sVar10 = pgVar42->nb[1];
                              sVar11 = pgVar42->nb[2];
                              sVar12 = pgVar42->nb[3];
                              gVar2 = pgVar41->type;
                              iVar3 = *(int *)&pgVar41->field_0x4;
                              lVar33 = ggml_nrows();
                              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                              lVar52 = (int)gVar2 * lVar34;
                              lVar34 = lVar34 + lVar52;
                              if (lVar33 <= lVar34) {
                                lVar34 = lVar33;
                              }
                              if (lVar52 < lVar34) {
                                lVar35 = lVar35 * lVar39;
                                pvVar9 = pgVar42->data;
                                pvVar13 = pgVar14->data;
                                do {
                                  lVar33 = lVar52 / lVar35;
                                  lVar38 = lVar52 % lVar35;
                                  lVar55 = lVar38 / lVar39;
                                  lVar38 = lVar38 % lVar39;
                                  if (0 < lVar36) {
                                    lVar53 = 0;
                                    do {
                                      auVar70._0_4_ =
                                           (*(float *)(&ggml_table_f32_f16 +
                                                      (ulong)*(ushort *)
                                                              ((long)pvVar13 +
                                                              lVar53 * 2 +
                                                              lVar55 * sVar7 +
                                                              lVar38 * sVar6 + lVar33 * sVar8) * 4)
                                           + 3.0) / 6.0;
                                      auVar70._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                      auVar70 = vmaxss_avx(auVar70,ZEXT816(0) << 0x40);
                                      auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                                      *(float *)((long)pvVar9 +
                                                lVar53 * 4 +
                                                lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12)
                                           = *(float *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar13 +
                                                               lVar53 * 2 +
                                                               lVar55 * sVar7 +
                                                               lVar38 * sVar6 + lVar33 * sVar8) * 4)
                                             * auVar70._0_4_;
                                      lVar53 = lVar53 + 1;
                                    } while (lVar36 != lVar53);
                                  }
                                  lVar52 = lVar52 + 1;
                                } while (lVar52 != lVar34);
                              }
                              return;
                            }
                            goto LAB_0012e6e5;
                          }
LAB_0012e6c9:
                          pcVar37 = "nb0 == sizeof(dst_t)";
                          uVar40 = 0x55;
                          goto LAB_0012e6ff;
                        }
                      }
                      pcVar37 = 
                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                      ;
                      uVar40 = 0x51;
LAB_0012e6ff:
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                 ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
                    }
                    cVar30 = ggml_is_contiguous_1(pgVar42);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                      if (pgVar41->nb[0] == 4) {
                        if (pgVar42->nb[0] == 2) {
                          lVar39 = pgVar42->ne[1];
                          lVar35 = pgVar42->ne[2];
                          sVar6 = pgVar42->nb[1];
                          sVar7 = pgVar42->nb[2];
                          sVar8 = pgVar42->nb[3];
                          lVar36 = pgVar41->ne[0];
                          sVar10 = pgVar41->nb[1];
                          sVar11 = pgVar41->nb[2];
                          sVar12 = pgVar41->nb[3];
                          gVar2 = pgVar43->type;
                          iVar3 = *(int *)&pgVar43->field_0x4;
                          lVar33 = ggml_nrows(pgVar42);
                          lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                          lVar52 = (int)gVar2 * lVar34;
                          lVar34 = lVar34 + lVar52;
                          if (lVar33 <= lVar34) {
                            lVar34 = lVar33;
                          }
                          if (lVar52 < lVar34) {
                            lVar35 = lVar35 * lVar39;
                            pvVar9 = pgVar41->data;
                            pvVar13 = pgVar42->data;
                            do {
                              lVar33 = lVar52 / lVar35;
                              lVar38 = lVar52 % lVar35;
                              lVar55 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar53 = 0;
                                do {
                                  fVar69 = expf(*(float *)(&ggml_table_f32_f16 +
                                                          (ulong)*(ushort *)
                                                                  ((long)pvVar13 +
                                                                  lVar53 * 2 +
                                                                  lVar55 * sVar7 +
                                                                  lVar38 * sVar6 + lVar33 * sVar8) *
                                                          4));
                                  *(float *)((long)pvVar9 +
                                            lVar53 * 4 +
                                            lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                       fVar69;
                                  lVar53 = lVar53 + 1;
                                } while (lVar36 != lVar53);
                              }
                              lVar52 = lVar52 + 1;
                            } while (lVar52 != lVar34);
                          }
                          return;
                        }
                        goto LAB_0012dd7a;
                      }
LAB_0012dd5e:
                      pcVar37 = "nb0 == sizeof(dst_t)";
                      uVar40 = 0x55;
                      goto LAB_0012dd94;
                    }
                  }
                  pcVar37 = 
                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                  ;
                  uVar40 = 0x51;
LAB_0012dd94:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                             ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
                }
                cVar30 = ggml_is_contiguous_1(pgVar41);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                  if (pgVar43->nb[0] == 4) {
                    if (pgVar41->nb[0] == 2) {
                      lVar39 = pgVar41->ne[1];
                      lVar35 = pgVar41->ne[2];
                      sVar6 = pgVar41->nb[1];
                      sVar7 = pgVar41->nb[2];
                      sVar8 = pgVar41->nb[3];
                      lVar36 = pgVar43->ne[0];
                      sVar10 = pgVar43->nb[1];
                      sVar11 = pgVar43->nb[2];
                      sVar12 = pgVar43->nb[3];
                      gVar2 = pgVar42->type;
                      iVar3 = *(int *)&pgVar42->field_0x4;
                      lVar33 = ggml_nrows();
                      lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                      lVar52 = (int)gVar2 * lVar34;
                      lVar34 = lVar34 + lVar52;
                      if (lVar33 <= lVar34) {
                        lVar34 = lVar33;
                      }
                      if (lVar52 < lVar34) {
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar43->data;
                        pvVar13 = pgVar41->data;
                        do {
                          lVar33 = lVar52 / lVar35;
                          lVar38 = lVar52 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar53 = 0;
                            do {
                              auVar75._0_4_ =
                                   (*(float *)(&ggml_table_f32_f16 +
                                              (ulong)*(ushort *)
                                                      ((long)pvVar13 +
                                                      lVar53 * 2 +
                                                      lVar55 * sVar7 +
                                                      lVar38 * sVar6 + lVar33 * sVar8) * 4) + 3.0) /
                                   6.0;
                              auVar75._4_12_ = SUB6012((undefined1  [60])0x0,0);
                              auVar70 = vmaxss_avx(auVar75,ZEXT816(0) << 0x40);
                              auVar70 = vminss_avx(auVar70,SUB6416(ZEXT464(0x3f800000),0));
                              *(int *)((long)pvVar9 +
                                      lVar53 * 4 +
                                      lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                   auVar70._0_4_;
                              lVar53 = lVar53 + 1;
                            } while (lVar36 != lVar53);
                          }
                          lVar52 = lVar52 + 1;
                        } while (lVar52 != lVar34);
                      }
                      return;
                    }
                    goto LAB_0012d49a;
                  }
LAB_0012d47e:
                  pcVar37 = "nb0 == sizeof(dst_t)";
                  uVar40 = 0x55;
                  goto LAB_0012d4b4;
                }
              }
              pcVar37 = 
              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
              ;
              uVar40 = 0x51;
LAB_0012d4b4:
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                         ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
            }
            cVar30 = ggml_is_contiguous_1(pgVar43);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
              if (pgVar42->nb[0] == 4) {
                if (pgVar43->nb[0] == 2) {
                  lVar39 = pgVar43->ne[1];
                  lVar35 = pgVar43->ne[2];
                  sVar6 = pgVar43->nb[1];
                  sVar7 = pgVar43->nb[2];
                  sVar8 = pgVar43->nb[3];
                  lVar36 = pgVar42->ne[0];
                  sVar10 = pgVar42->nb[1];
                  sVar11 = pgVar42->nb[2];
                  sVar12 = pgVar42->nb[3];
                  gVar2 = pgVar41->type;
                  iVar3 = *(int *)&pgVar41->field_0x4;
                  lVar33 = ggml_nrows(pgVar43);
                  lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                  lVar52 = (int)gVar2 * lVar34;
                  lVar34 = lVar34 + lVar52;
                  if (lVar33 <= lVar34) {
                    lVar34 = lVar33;
                  }
                  if (lVar52 < lVar34) {
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar42->data;
                    pvVar13 = pgVar43->data;
                    do {
                      lVar33 = lVar52 / lVar35;
                      lVar38 = lVar52 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar53 = 0;
                        do {
                          fVar69 = expf(-*(float *)(&ggml_table_f32_f16 +
                                                   (ulong)*(ushort *)
                                                           ((long)pvVar13 +
                                                           lVar53 * 2 +
                                                           lVar55 * sVar7 +
                                                           lVar38 * sVar6 + lVar33 * sVar8) * 4));
                          *(float *)((long)pvVar9 +
                                    lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12
                                    ) = 1.0 / (fVar69 + 1.0);
                          lVar53 = lVar53 + 1;
                        } while (lVar36 != lVar53);
                      }
                      lVar52 = lVar52 + 1;
                    } while (lVar52 != lVar34);
                  }
                  return;
                }
                goto LAB_0012cb55;
              }
LAB_0012cb39:
              pcVar37 = "nb0 == sizeof(dst_t)";
              uVar40 = 0x55;
              goto LAB_0012cb6f;
            }
          }
          pcVar37 = 
          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
          ;
          uVar40 = 0x51;
LAB_0012cb6f:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                     ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
        }
        cVar30 = ggml_is_contiguous_1(pgVar42);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
          if (pgVar41->nb[0] == 4) {
            if (pgVar42->nb[0] == 2) {
              lVar39 = pgVar42->ne[1];
              lVar35 = pgVar42->ne[2];
              sVar6 = pgVar42->nb[1];
              sVar7 = pgVar42->nb[2];
              sVar8 = pgVar42->nb[3];
              lVar36 = pgVar41->ne[0];
              sVar10 = pgVar41->nb[1];
              sVar11 = pgVar41->nb[2];
              sVar12 = pgVar41->nb[3];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar33 = ggml_nrows();
              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
              lVar52 = (int)gVar2 * lVar34;
              lVar34 = lVar34 + lVar52;
              if (lVar33 <= lVar34) {
                lVar34 = lVar33;
              }
              if (lVar52 < lVar34) {
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar41->data;
                pvVar13 = pgVar42->data;
                do {
                  lVar33 = lVar52 / lVar35;
                  lVar38 = lVar52 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    lVar53 = 0;
                    do {
                      auVar70 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pvVar13 +
                                                                    lVar53 * 2 +
                                                                    lVar55 * sVar7 +
                                                                    lVar38 * sVar6 + lVar33 * sVar8)
                                                            * 4)),ZEXT816(0) << 0x40);
                      *(int *)((long)pvVar9 +
                              lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                           auVar70._0_4_;
                      lVar53 = lVar53 + 1;
                    } while (lVar36 != lVar53);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 != lVar34);
              }
              return;
            }
            goto LAB_0012c1d1;
          }
LAB_0012c1b5:
          pcVar37 = "nb0 == sizeof(dst_t)";
          uVar40 = 0x55;
          goto LAB_0012c1eb;
        }
      }
      pcVar37 = 
      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
      uVar40 = 0x51;
LAB_0012c1eb:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                 ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
    }
    cVar30 = ggml_is_contiguous_1(pgVar45);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar45,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar45->nb[0] == 2) {
          lVar39 = pgVar45->ne[1];
          lVar35 = pgVar45->ne[2];
          sVar6 = pgVar45->nb[1];
          sVar7 = pgVar45->nb[2];
          sVar8 = pgVar45->nb[3];
          lVar36 = dst->ne[0];
          sVar10 = dst->nb[1];
          sVar11 = dst->nb[2];
          sVar12 = dst->nb[3];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar33 = ggml_nrows(pgVar45);
          lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
          lVar52 = iVar3 * lVar34;
          lVar34 = lVar34 + lVar52;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar52 < lVar34) {
            lVar35 = lVar35 * lVar39;
            do {
              lVar33 = lVar52 / lVar35;
              lVar38 = lVar52 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                pvVar9 = dst->data;
                pvVar13 = pgVar45->data;
                lVar53 = 0;
                do {
                  fVar69 = *(float *)(&ggml_table_f32_f16 +
                                     (ulong)*(ushort *)
                                             ((long)pvVar13 +
                                             lVar53 * 2 +
                                             lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) * 4);
                  if (fVar69 <= 0.0) {
                    fVar69 = expm1f(fVar69);
                  }
                  *(float *)((long)pvVar9 +
                            lVar53 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                       fVar69;
                  lVar53 = lVar53 + 1;
                } while (lVar36 != lVar53);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
          }
          return;
        }
        goto LAB_0012b94b;
      }
LAB_0012b92f:
      pcVar37 = "nb0 == sizeof(dst_t)";
      uVar40 = 0x55;
      goto LAB_0012b965;
    }
  }
  pcVar37 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar40 = 0x51;
LAB_0012b965:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar40,"GGML_ASSERT(%s) failed",pcVar37);
}

Assistant:

void ggml_compute_forward_elu(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_elu>(params, dst);
}